

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar38;
  undefined8 in_R10;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar59 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  float fVar105;
  float fVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float t1;
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vfloat4 b0;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  vfloat4 a0_3;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vfloat4 a0_2;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar181 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar199 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar214;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  vfloat4 a0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar34;
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar233 [32];
  
  uVar33 = (ulong)(byte)prim[1];
  fVar213 = *(float *)(prim + uVar33 * 0x19 + 0x12);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar49 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar47 = vsubps_avx(auVar46,*(undefined1 (*) [16])(prim + uVar33 * 0x19 + 6));
  fVar122 = fVar213 * auVar47._0_4_;
  fVar105 = fVar213 * auVar49._0_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar33 * 4 + 6);
  auVar79 = vpmovsxbd_avx2(auVar46);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar33 * 5 + 6);
  auVar76 = vpmovsxbd_avx2(auVar58);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar33 * 6 + 6);
  auVar77 = vpmovsxbd_avx2(auVar4);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar33 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar57);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar33 * 0xc + 6);
  auVar89 = vpmovsxbd_avx2(auVar56);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar33 * 0xd + 6);
  auVar78 = vpmovsxbd_avx2(auVar55);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar33 * 0x12 + 6);
  auVar80 = vpmovsxbd_avx2(auVar5);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar33 * 0x13 + 6);
  auVar83 = vpmovsxbd_avx2(auVar54);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar83);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar33 * 0x14 + 6);
  auVar74 = vpmovsxbd_avx2(auVar6);
  auVar82 = vcvtdq2ps_avx(auVar74);
  auVar132._4_4_ = fVar105;
  auVar132._0_4_ = fVar105;
  auVar132._8_4_ = fVar105;
  auVar132._12_4_ = fVar105;
  auVar132._16_4_ = fVar105;
  auVar132._20_4_ = fVar105;
  auVar132._24_4_ = fVar105;
  auVar132._28_4_ = fVar105;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar84 = ZEXT1632(CONCAT412(fVar213 * auVar49._12_4_,
                               CONCAT48(fVar213 * auVar49._8_4_,
                                        CONCAT44(fVar213 * auVar49._4_4_,fVar105))));
  auVar75 = vpermps_avx2(auVar238,auVar84);
  auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar246 = ZEXT3264(auVar72);
  auVar73 = vpermps_avx512vl(auVar72,auVar84);
  fVar105 = auVar73._0_4_;
  fVar209 = auVar73._4_4_;
  auVar84._4_4_ = fVar209 * auVar77._4_4_;
  auVar84._0_4_ = fVar105 * auVar77._0_4_;
  fVar211 = auVar73._8_4_;
  auVar84._8_4_ = fVar211 * auVar77._8_4_;
  fVar110 = auVar73._12_4_;
  auVar84._12_4_ = fVar110 * auVar77._12_4_;
  fVar111 = auVar73._16_4_;
  auVar84._16_4_ = fVar111 * auVar77._16_4_;
  fVar112 = auVar73._20_4_;
  auVar84._20_4_ = fVar112 * auVar77._20_4_;
  fVar113 = auVar73._24_4_;
  auVar84._24_4_ = fVar113 * auVar77._24_4_;
  auVar84._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar78._4_4_ * fVar209;
  auVar83._0_4_ = auVar78._0_4_ * fVar105;
  auVar83._8_4_ = auVar78._8_4_ * fVar211;
  auVar83._12_4_ = auVar78._12_4_ * fVar110;
  auVar83._16_4_ = auVar78._16_4_ * fVar111;
  auVar83._20_4_ = auVar78._20_4_ * fVar112;
  auVar83._24_4_ = auVar78._24_4_ * fVar113;
  auVar83._28_4_ = auVar74._28_4_;
  auVar74._4_4_ = auVar82._4_4_ * fVar209;
  auVar74._0_4_ = auVar82._0_4_ * fVar105;
  auVar74._8_4_ = auVar82._8_4_ * fVar211;
  auVar74._12_4_ = auVar82._12_4_ * fVar110;
  auVar74._16_4_ = auVar82._16_4_ * fVar111;
  auVar74._20_4_ = auVar82._20_4_ * fVar112;
  auVar74._24_4_ = auVar82._24_4_ * fVar113;
  auVar74._28_4_ = auVar73._28_4_;
  auVar46 = vfmadd231ps_fma(auVar84,auVar75,auVar76);
  auVar58 = vfmadd231ps_fma(auVar83,auVar75,auVar89);
  auVar4 = vfmadd231ps_fma(auVar74,auVar81,auVar75);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar132,auVar79);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar132,auVar88);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar80,auVar132);
  auVar145._4_4_ = fVar122;
  auVar145._0_4_ = fVar122;
  auVar145._8_4_ = fVar122;
  auVar145._12_4_ = fVar122;
  auVar145._16_4_ = fVar122;
  auVar145._20_4_ = fVar122;
  auVar145._24_4_ = fVar122;
  auVar145._28_4_ = fVar122;
  auVar74 = ZEXT1632(CONCAT412(fVar213 * auVar47._12_4_,
                               CONCAT48(fVar213 * auVar47._8_4_,
                                        CONCAT44(fVar213 * auVar47._4_4_,fVar122))));
  auVar83 = vpermps_avx2(auVar238,auVar74);
  auVar74 = vpermps_avx512vl(auVar72,auVar74);
  auVar75 = vmulps_avx512vl(auVar74,auVar77);
  auVar86._0_4_ = auVar74._0_4_ * auVar78._0_4_;
  auVar86._4_4_ = auVar74._4_4_ * auVar78._4_4_;
  auVar86._8_4_ = auVar74._8_4_ * auVar78._8_4_;
  auVar86._12_4_ = auVar74._12_4_ * auVar78._12_4_;
  auVar86._16_4_ = auVar74._16_4_ * auVar78._16_4_;
  auVar86._20_4_ = auVar74._20_4_ * auVar78._20_4_;
  auVar86._24_4_ = auVar74._24_4_ * auVar78._24_4_;
  auVar86._28_4_ = 0;
  auVar78._4_4_ = auVar74._4_4_ * auVar82._4_4_;
  auVar78._0_4_ = auVar74._0_4_ * auVar82._0_4_;
  auVar78._8_4_ = auVar74._8_4_ * auVar82._8_4_;
  auVar78._12_4_ = auVar74._12_4_ * auVar82._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * auVar82._16_4_;
  auVar78._20_4_ = auVar74._20_4_ * auVar82._20_4_;
  auVar78._24_4_ = auVar74._24_4_ * auVar82._24_4_;
  auVar78._28_4_ = auVar77._28_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar83,auVar76);
  auVar57 = vfmadd231ps_fma(auVar86,auVar83,auVar89);
  auVar56 = vfmadd231ps_fma(auVar78,auVar83,auVar81);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar145,auVar79);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar145,auVar88);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar145,auVar80);
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  auVar79 = vandps_avx(ZEXT1632(auVar46),auVar90);
  auVar92._8_4_ = 0x219392ef;
  auVar92._0_8_ = 0x219392ef219392ef;
  auVar92._12_4_ = 0x219392ef;
  auVar92._16_4_ = 0x219392ef;
  auVar92._20_4_ = 0x219392ef;
  auVar92._24_4_ = 0x219392ef;
  auVar92._28_4_ = 0x219392ef;
  uVar39 = vcmpps_avx512vl(auVar79,auVar92,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar75._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar58),auVar90);
  uVar39 = vcmpps_avx512vl(auVar79,auVar92,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar72._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar4),auVar90);
  uVar39 = vcmpps_avx512vl(auVar79,auVar92,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar79._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = 0x3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar91._16_4_ = 0x3f800000;
  auVar91._20_4_ = 0x3f800000;
  auVar91._24_4_ = 0x3f800000;
  auVar91._28_4_ = 0x3f800000;
  auVar46 = vfnmadd213ps_fma(auVar75,auVar77,auVar91);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar72);
  auVar58 = vfnmadd213ps_fma(auVar72,auVar77,auVar91);
  auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar79);
  auVar4 = vfnmadd213ps_fma(auVar79,auVar77,auVar91);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 7 + 6));
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar77,auVar77);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77 = vsubps_avx512vl(auVar79,auVar76);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 9 + 6));
  auVar80._4_4_ = auVar46._4_4_ * auVar77._4_4_;
  auVar80._0_4_ = auVar46._0_4_ * auVar77._0_4_;
  auVar80._8_4_ = auVar46._8_4_ * auVar77._8_4_;
  auVar80._12_4_ = auVar46._12_4_ * auVar77._12_4_;
  auVar80._16_4_ = auVar77._16_4_ * 0.0;
  auVar80._20_4_ = auVar77._20_4_ * 0.0;
  auVar80._24_4_ = auVar77._24_4_ * 0.0;
  auVar80._28_4_ = auVar77._28_4_;
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76 = vsubps_avx512vl(auVar79,auVar76);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 0xe + 6));
  auVar87._0_4_ = auVar46._0_4_ * auVar76._0_4_;
  auVar87._4_4_ = auVar46._4_4_ * auVar76._4_4_;
  auVar87._8_4_ = auVar46._8_4_ * auVar76._8_4_;
  auVar87._12_4_ = auVar46._12_4_ * auVar76._12_4_;
  auVar87._16_4_ = auVar76._16_4_ * 0.0;
  auVar87._20_4_ = auVar76._20_4_ * 0.0;
  auVar87._24_4_ = auVar76._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar81._4_4_ = auVar58._4_4_ * auVar79._4_4_;
  auVar81._0_4_ = auVar58._0_4_ * auVar79._0_4_;
  auVar81._8_4_ = auVar58._8_4_ * auVar79._8_4_;
  auVar81._12_4_ = auVar58._12_4_ * auVar79._12_4_;
  auVar81._16_4_ = auVar79._16_4_ * 0.0;
  auVar81._20_4_ = auVar79._20_4_ * 0.0;
  auVar81._24_4_ = auVar79._24_4_ * 0.0;
  auVar81._28_4_ = auVar79._28_4_;
  auVar78 = vpbroadcastd_avx512vl();
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar85._0_4_ = auVar58._0_4_ * auVar79._0_4_;
  auVar85._4_4_ = auVar58._4_4_ * auVar79._4_4_;
  auVar85._8_4_ = auVar58._8_4_ * auVar79._8_4_;
  auVar85._12_4_ = auVar58._12_4_ * auVar79._12_4_;
  auVar85._16_4_ = auVar79._16_4_ * 0.0;
  auVar85._20_4_ = auVar79._20_4_ * 0.0;
  auVar85._24_4_ = auVar79._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 0x15 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar56));
  auVar82._4_4_ = auVar79._4_4_ * auVar4._4_4_;
  auVar82._0_4_ = auVar79._0_4_ * auVar4._0_4_;
  auVar82._8_4_ = auVar79._8_4_ * auVar4._8_4_;
  auVar82._12_4_ = auVar79._12_4_ * auVar4._12_4_;
  auVar82._16_4_ = auVar79._16_4_ * 0.0;
  auVar82._20_4_ = auVar79._20_4_ * 0.0;
  auVar82._24_4_ = auVar79._24_4_ * 0.0;
  auVar82._28_4_ = auVar79._28_4_;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 0x17 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar56));
  auVar73._0_4_ = auVar4._0_4_ * auVar79._0_4_;
  auVar73._4_4_ = auVar4._4_4_ * auVar79._4_4_;
  auVar73._8_4_ = auVar4._8_4_ * auVar79._8_4_;
  auVar73._12_4_ = auVar4._12_4_ * auVar79._12_4_;
  auVar73._16_4_ = auVar79._16_4_ * 0.0;
  auVar73._20_4_ = auVar79._20_4_ * 0.0;
  auVar73._24_4_ = auVar79._24_4_ * 0.0;
  auVar73._28_4_ = 0;
  auVar79 = vpminsd_avx2(auVar80,auVar87);
  auVar76 = vpminsd_avx2(auVar81,auVar85);
  auVar79 = vmaxps_avx(auVar79,auVar76);
  auVar76 = vpminsd_avx2(auVar82,auVar73);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar77._4_4_ = uVar114;
  auVar77._0_4_ = uVar114;
  auVar77._8_4_ = uVar114;
  auVar77._12_4_ = uVar114;
  auVar77._16_4_ = uVar114;
  auVar77._20_4_ = uVar114;
  auVar77._24_4_ = uVar114;
  auVar77._28_4_ = uVar114;
  auVar76 = vmaxps_avx512vl(auVar76,auVar77);
  auVar79 = vmaxps_avx(auVar79,auVar76);
  auVar76._8_4_ = 0x3f7ffffa;
  auVar76._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar76._12_4_ = 0x3f7ffffa;
  auVar76._16_4_ = 0x3f7ffffa;
  auVar76._20_4_ = 0x3f7ffffa;
  auVar76._24_4_ = 0x3f7ffffa;
  auVar76._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar79,auVar76);
  auVar79 = vpmaxsd_avx2(auVar80,auVar87);
  auVar76 = vpmaxsd_avx2(auVar81,auVar85);
  auVar79 = vminps_avx(auVar79,auVar76);
  auVar76 = vpmaxsd_avx2(auVar82,auVar73);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar88._4_4_ = uVar114;
  auVar88._0_4_ = uVar114;
  auVar88._8_4_ = uVar114;
  auVar88._12_4_ = uVar114;
  auVar88._16_4_ = uVar114;
  auVar88._20_4_ = uVar114;
  auVar88._24_4_ = uVar114;
  auVar88._28_4_ = uVar114;
  auVar76 = vminps_avx512vl(auVar76,auVar88);
  auVar79 = vminps_avx(auVar79,auVar76);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar89);
  uVar17 = vcmpps_avx512vl(local_1c0,auVar79,2);
  uVar18 = vpcmpgtd_avx512vl(auVar78,_DAT_01fb4ba0);
  uVar39 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar18));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar240 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar46);
  auVar248 = ZEXT464(0x3f800000);
  auVar46 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar247 = ZEXT1664(auVar46);
LAB_01a675a6:
  if (uVar39 == 0) {
LAB_01a69156:
    return uVar39 != 0;
  }
  lVar35 = 0;
  for (uVar33 = uVar39; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    lVar35 = lVar35 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  uVar33 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar35 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar46 = *(undefined1 (*) [16])(_Var12 + uVar33 * (long)pvVar11);
  auVar58 = *(undefined1 (*) [16])(_Var12 + (uVar33 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar33 + 2) * (long)pvVar11);
  auVar57 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar33 + 3));
  lVar35 = *(long *)&pGVar9[1].time_range.upper;
  auVar56 = *(undefined1 (*) [16])(lVar35 + (long)p_Var10 * uVar33);
  auVar55 = *(undefined1 (*) [16])(lVar35 + (long)p_Var10 * (uVar33 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar35 + (long)p_Var10 * (uVar33 + 2));
  uVar40 = uVar39 - 1 & uVar39;
  auVar54 = *(undefined1 (*) [16])(lVar35 + (long)p_Var10 * (uVar33 + 3));
  if (uVar40 != 0) {
    uVar38 = uVar40 - 1 & uVar40;
    for (uVar33 = uVar40; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    }
    if (uVar38 != 0) {
      for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar116 = auVar239._0_16_;
  auVar47 = vmulps_avx512vl(auVar54,auVar116);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar47);
  auVar48._0_4_ = auVar55._0_4_ + auVar49._0_4_;
  auVar48._4_4_ = auVar55._4_4_ + auVar49._4_4_;
  auVar48._8_4_ = auVar55._8_4_ + auVar49._8_4_;
  auVar48._12_4_ = auVar55._12_4_ + auVar49._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar116);
  auVar59 = ZEXT816(0) << 0x40;
  auVar52._0_4_ = auVar54._0_4_ * 0.0;
  auVar52._4_4_ = auVar54._4_4_ * 0.0;
  auVar52._8_4_ = auVar54._8_4_ * 0.0;
  auVar52._12_4_ = auVar54._12_4_ * 0.0;
  auVar68 = auVar240._0_16_;
  auVar49 = vfmadd231ps_avx512vl(auVar52,auVar5,auVar68);
  auVar49 = vfmadd231ps_fma(auVar49,auVar55,auVar59);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar56,auVar68);
  auVar51 = vmulps_avx512vl(auVar57,auVar116);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar51);
  auVar225._0_4_ = auVar49._0_4_ + auVar58._0_4_;
  auVar225._4_4_ = auVar49._4_4_ + auVar58._4_4_;
  auVar225._8_4_ = auVar49._8_4_ + auVar58._8_4_;
  auVar225._12_4_ = auVar49._12_4_ + auVar58._12_4_;
  auVar52 = vfmadd231ps_avx512vl(auVar225,auVar46,auVar116);
  auVar229._0_4_ = auVar57._0_4_ * 0.0;
  auVar229._4_4_ = auVar57._4_4_ * 0.0;
  auVar229._8_4_ = auVar57._8_4_ * 0.0;
  auVar229._12_4_ = auVar57._12_4_ * 0.0;
  auVar49 = vfmadd231ps_avx512vl(auVar229,auVar4,auVar68);
  auVar49 = vfmadd231ps_fma(auVar49,auVar58,auVar59);
  auVar53 = vfnmadd231ps_avx512vl(auVar49,auVar46,auVar68);
  auVar62._0_4_ = auVar5._0_4_ + auVar47._0_4_;
  auVar62._4_4_ = auVar5._4_4_ + auVar47._4_4_;
  auVar62._8_4_ = auVar5._8_4_ + auVar47._8_4_;
  auVar62._12_4_ = auVar5._12_4_ + auVar47._12_4_;
  auVar49 = vfmadd231ps_fma(auVar62,auVar55,auVar59);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar56,auVar116);
  auVar54 = vmulps_avx512vl(auVar54,auVar68);
  auVar5 = vfmadd231ps_fma(auVar54,auVar59,auVar5);
  auVar55 = vfnmadd231ps_avx512vl(auVar5,auVar68,auVar55);
  auVar5 = vfmadd231ps_fma(auVar55,auVar59,auVar56);
  auVar177._0_4_ = auVar51._0_4_ + auVar4._0_4_;
  auVar177._4_4_ = auVar51._4_4_ + auVar4._4_4_;
  auVar177._8_4_ = auVar51._8_4_ + auVar4._8_4_;
  auVar177._12_4_ = auVar51._12_4_ + auVar4._12_4_;
  auVar56 = vfmadd231ps_fma(auVar177,auVar58,auVar59);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar46,auVar116);
  auVar57 = vmulps_avx512vl(auVar57,auVar68);
  auVar4 = vfmadd231ps_fma(auVar57,auVar59,auVar4);
  auVar58 = vfnmadd231ps_avx512vl(auVar4,auVar68,auVar58);
  auVar55 = vfmadd231ps_fma(auVar58,auVar59,auVar46);
  auVar46 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar58 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar110 = auVar50._0_4_;
  auVar61._0_4_ = fVar110 * auVar58._0_4_;
  fVar111 = auVar50._4_4_;
  auVar61._4_4_ = fVar111 * auVar58._4_4_;
  fVar112 = auVar50._8_4_;
  auVar61._8_4_ = fVar112 * auVar58._8_4_;
  fVar113 = auVar50._12_4_;
  auVar61._12_4_ = fVar113 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar61,auVar46,auVar52);
  auVar4 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar67._0_4_ = fVar110 * auVar58._0_4_;
  auVar67._4_4_ = fVar111 * auVar58._4_4_;
  auVar67._8_4_ = fVar112 * auVar58._8_4_;
  auVar67._12_4_ = fVar113 * auVar58._12_4_;
  auVar46 = vfmsub231ps_fma(auVar67,auVar46,auVar53);
  auVar57 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar122 = auVar5._0_4_;
  auVar138._0_4_ = fVar122 * auVar58._0_4_;
  fVar135 = auVar5._4_4_;
  auVar138._4_4_ = fVar135 * auVar58._4_4_;
  fVar136 = auVar5._8_4_;
  auVar138._8_4_ = fVar136 * auVar58._8_4_;
  fVar137 = auVar5._12_4_;
  auVar138._12_4_ = fVar137 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar138,auVar46,auVar56);
  auVar56 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar178._0_4_ = auVar58._0_4_ * fVar122;
  auVar178._4_4_ = auVar58._4_4_ * fVar135;
  auVar178._8_4_ = auVar58._8_4_ * fVar136;
  auVar178._12_4_ = auVar58._12_4_ * fVar137;
  auVar46 = vfmsub231ps_fma(auVar178,auVar46,auVar55);
  auVar55 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar105 = auVar46._0_4_;
  auVar179._4_12_ = ZEXT812(0) << 0x20;
  auVar179._0_4_ = fVar105;
  auVar58 = vrsqrt14ss_avx512f(auVar59,auVar179);
  auVar54 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar46,ZEXT416(0xbf000000));
  fVar213 = auVar58._0_4_;
  fVar213 = auVar54._0_4_ + auVar47._0_4_ * fVar213 * fVar213 * fVar213;
  fVar214 = fVar213 * auVar4._0_4_;
  fVar222 = fVar213 * auVar4._4_4_;
  fVar223 = fVar213 * auVar4._8_4_;
  fVar224 = fVar213 * auVar4._12_4_;
  auVar58 = vdpps_avx(auVar4,auVar57,0x7f);
  auVar191._0_4_ = auVar57._0_4_ * fVar105;
  auVar191._4_4_ = auVar57._4_4_ * fVar105;
  auVar191._8_4_ = auVar57._8_4_ * fVar105;
  auVar191._12_4_ = auVar57._12_4_ * fVar105;
  fVar105 = auVar58._0_4_;
  auVar156._0_4_ = fVar105 * auVar4._0_4_;
  auVar156._4_4_ = fVar105 * auVar4._4_4_;
  auVar156._8_4_ = fVar105 * auVar4._8_4_;
  auVar156._12_4_ = fVar105 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar191,auVar156);
  auVar58 = vrcp14ss_avx512f(auVar59,auVar179);
  auVar46 = vfnmadd213ss_avx512f(auVar46,auVar58,ZEXT416(0x40000000));
  fVar209 = auVar58._0_4_ * auVar46._0_4_;
  auVar46 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar211 = auVar46._0_4_;
  auVar170._4_12_ = ZEXT812(0) << 0x20;
  auVar170._0_4_ = fVar211;
  auVar58 = vrsqrt14ss_avx512f(auVar59,auVar170);
  auVar57 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar46,ZEXT416(0xbf000000));
  fVar105 = auVar58._0_4_;
  fVar105 = auVar57._0_4_ + auVar54._0_4_ * fVar105 * fVar105 * fVar105;
  fVar198 = fVar105 * auVar56._0_4_;
  fVar208 = fVar105 * auVar56._4_4_;
  fVar210 = fVar105 * auVar56._8_4_;
  fVar212 = fVar105 * auVar56._12_4_;
  auVar58 = vdpps_avx(auVar56,auVar55,0x7f);
  auVar69._0_4_ = fVar211 * auVar55._0_4_;
  auVar69._4_4_ = fVar211 * auVar55._4_4_;
  auVar69._8_4_ = fVar211 * auVar55._8_4_;
  auVar69._12_4_ = fVar211 * auVar55._12_4_;
  fVar211 = auVar58._0_4_;
  auVar60._0_4_ = fVar211 * auVar56._0_4_;
  auVar60._4_4_ = fVar211 * auVar56._4_4_;
  auVar60._8_4_ = fVar211 * auVar56._8_4_;
  auVar60._12_4_ = fVar211 * auVar56._12_4_;
  auVar57 = vsubps_avx(auVar69,auVar60);
  auVar58 = vrcp14ss_avx512f(auVar59,auVar170);
  auVar46 = vfnmadd213ss_avx512f(auVar46,auVar58,ZEXT416(0x40000000));
  fVar211 = auVar46._0_4_ * auVar58._0_4_;
  auVar46 = vshufps_avx(auVar48,auVar48,0xff);
  auVar171._0_4_ = fVar214 * auVar46._0_4_;
  auVar171._4_4_ = fVar222 * auVar46._4_4_;
  auVar171._8_4_ = fVar223 * auVar46._8_4_;
  auVar171._12_4_ = fVar224 * auVar46._12_4_;
  local_350 = vsubps_avx(auVar48,auVar171);
  auVar58 = vshufps_avx(auVar50,auVar50,0xff);
  auVar70._0_4_ = auVar58._0_4_ * fVar214 + auVar46._0_4_ * fVar213 * fVar209 * auVar4._0_4_;
  auVar70._4_4_ = auVar58._4_4_ * fVar222 + auVar46._4_4_ * fVar213 * fVar209 * auVar4._4_4_;
  auVar70._8_4_ = auVar58._8_4_ * fVar223 + auVar46._8_4_ * fVar213 * fVar209 * auVar4._8_4_;
  auVar70._12_4_ = auVar58._12_4_ * fVar224 + auVar46._12_4_ * fVar213 * fVar209 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar50,auVar70);
  local_360._0_4_ = auVar171._0_4_ + auVar48._0_4_;
  local_360._4_4_ = auVar171._4_4_ + auVar48._4_4_;
  fStack_358 = auVar171._8_4_ + auVar48._8_4_;
  fStack_354 = auVar171._12_4_ + auVar48._12_4_;
  auVar46 = vshufps_avx(auVar49,auVar49,0xff);
  auVar148._0_4_ = fVar198 * auVar46._0_4_;
  auVar148._4_4_ = fVar208 * auVar46._4_4_;
  auVar148._8_4_ = fVar210 * auVar46._8_4_;
  auVar148._12_4_ = fVar212 * auVar46._12_4_;
  local_370 = vsubps_avx(auVar49,auVar148);
  auVar58 = vshufps_avx(auVar5,auVar5,0xff);
  auVar59._0_4_ = auVar58._0_4_ * fVar198 + auVar46._0_4_ * fVar105 * auVar57._0_4_ * fVar211;
  auVar59._4_4_ = auVar58._4_4_ * fVar208 + auVar46._4_4_ * fVar105 * auVar57._4_4_ * fVar211;
  auVar59._8_4_ = auVar58._8_4_ * fVar210 + auVar46._8_4_ * fVar105 * auVar57._8_4_ * fVar211;
  auVar59._12_4_ = auVar58._12_4_ * fVar212 + auVar46._12_4_ * fVar105 * auVar57._12_4_ * fVar211;
  auVar46 = vsubps_avx(auVar5,auVar59);
  _local_380 = vaddps_avx512vl(auVar49,auVar148);
  auVar63._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar4._12_4_ * 0.33333334;
  local_390 = vaddps_avx512vl(local_350,auVar63);
  auVar66._0_4_ = auVar46._0_4_ * 0.33333334;
  auVar66._4_4_ = auVar46._4_4_ * 0.33333334;
  auVar66._8_4_ = auVar46._8_4_ * 0.33333334;
  auVar66._12_4_ = auVar46._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx512vl(local_370,auVar66);
  auVar47._0_4_ = (fVar110 + auVar70._0_4_) * 0.33333334;
  auVar47._4_4_ = (fVar111 + auVar70._4_4_) * 0.33333334;
  auVar47._8_4_ = (fVar112 + auVar70._8_4_) * 0.33333334;
  auVar47._12_4_ = (fVar113 + auVar70._12_4_) * 0.33333334;
  _local_3b0 = vaddps_avx512vl(_local_360,auVar47);
  auVar50._0_4_ = (fVar122 + auVar59._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar135 + auVar59._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar136 + auVar59._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar137 + auVar59._12_4_) * 0.33333334;
  _local_3c0 = vsubps_avx512vl(_local_380,auVar50);
  local_2d0 = vsubps_avx(local_350,auVar6);
  uVar114 = local_2d0._0_4_;
  auVar68._4_4_ = uVar114;
  auVar68._0_4_ = uVar114;
  auVar68._8_4_ = uVar114;
  auVar68._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar58 = vshufps_avx(local_2d0,local_2d0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar213 = pre->ray_space[k].vz.field_0.m128[0];
  fVar105 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar211 = pre->ray_space[k].vz.field_0.m128[3];
  auVar51._0_4_ = fVar213 * auVar58._0_4_;
  auVar51._4_4_ = fVar105 * auVar58._4_4_;
  auVar51._8_4_ = fVar209 * auVar58._8_4_;
  auVar51._12_4_ = fVar211 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar46);
  auVar54 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar68);
  local_2e0 = vsubps_avx512vl(local_390,auVar6);
  uVar114 = local_2e0._0_4_;
  auVar64._4_4_ = uVar114;
  auVar64._0_4_ = uVar114;
  auVar64._8_4_ = uVar114;
  auVar64._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar58 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar71._0_4_ = fVar213 * auVar58._0_4_;
  auVar71._4_4_ = fVar105 * auVar58._4_4_;
  auVar71._8_4_ = fVar209 * auVar58._8_4_;
  auVar71._12_4_ = fVar211 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar46);
  auVar49 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar64);
  local_2f0 = vsubps_avx512vl(local_3a0,auVar6);
  uVar114 = local_2f0._0_4_;
  auVar157._4_4_ = uVar114;
  auVar157._0_4_ = uVar114;
  auVar157._8_4_ = uVar114;
  auVar157._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar58 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar65._0_4_ = fVar213 * auVar58._0_4_;
  auVar65._4_4_ = fVar105 * auVar58._4_4_;
  auVar65._8_4_ = fVar209 * auVar58._8_4_;
  auVar65._12_4_ = fVar211 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar46);
  auVar47 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar157);
  local_300 = vsubps_avx(local_370,auVar6);
  uVar114 = local_300._0_4_;
  auVar158._4_4_ = uVar114;
  auVar158._0_4_ = uVar114;
  auVar158._8_4_ = uVar114;
  auVar158._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_300,local_300,0x55);
  auVar58 = vshufps_avx(local_300,local_300,0xaa);
  auVar180._0_4_ = auVar58._0_4_ * fVar213;
  auVar180._4_4_ = auVar58._4_4_ * fVar105;
  auVar180._8_4_ = auVar58._8_4_ * fVar209;
  auVar180._12_4_ = auVar58._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar46);
  auVar48 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar158);
  local_310 = vsubps_avx(_local_360,auVar6);
  uVar114 = local_310._0_4_;
  auVar159._4_4_ = uVar114;
  auVar159._0_4_ = uVar114;
  auVar159._8_4_ = uVar114;
  auVar159._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_310,local_310,0x55);
  auVar58 = vshufps_avx(local_310,local_310,0xaa);
  auVar192._0_4_ = auVar58._0_4_ * fVar213;
  auVar192._4_4_ = auVar58._4_4_ * fVar105;
  auVar192._8_4_ = auVar58._8_4_ * fVar209;
  auVar192._12_4_ = auVar58._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar46);
  auVar50 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar159);
  local_320 = vsubps_avx512vl(_local_3b0,auVar6);
  uVar114 = local_320._0_4_;
  auVar160._4_4_ = uVar114;
  auVar160._0_4_ = uVar114;
  auVar160._8_4_ = uVar114;
  auVar160._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_320,local_320,0x55);
  auVar58 = vshufps_avx(local_320,local_320,0xaa);
  auVar199._0_4_ = auVar58._0_4_ * fVar213;
  auVar199._4_4_ = auVar58._4_4_ * fVar105;
  auVar199._8_4_ = auVar58._8_4_ * fVar209;
  auVar199._12_4_ = auVar58._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar3,auVar46);
  auVar51 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar160);
  local_330 = vsubps_avx512vl(_local_3c0,auVar6);
  uVar114 = local_330._0_4_;
  auVar161._4_4_ = uVar114;
  auVar161._0_4_ = uVar114;
  auVar161._8_4_ = uVar114;
  auVar161._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_330,local_330,0x55);
  auVar58 = vshufps_avx(local_330,local_330,0xaa);
  auVar215._0_4_ = auVar58._0_4_ * fVar213;
  auVar215._4_4_ = auVar58._4_4_ * fVar105;
  auVar215._8_4_ = auVar58._8_4_ * fVar209;
  auVar215._12_4_ = auVar58._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar3,auVar46);
  auVar52 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar161);
  local_340 = vsubps_avx512vl(_local_380,auVar6);
  uVar114 = local_340._0_4_;
  auVar53._4_4_ = uVar114;
  auVar53._0_4_ = uVar114;
  auVar53._8_4_ = uVar114;
  auVar53._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_340,local_340,0x55);
  auVar58 = vshufps_avx(local_340,local_340,0xaa);
  auVar149._0_4_ = auVar58._0_4_ * fVar213;
  auVar149._4_4_ = auVar58._4_4_ * fVar105;
  auVar149._8_4_ = auVar58._8_4_ * fVar209;
  auVar149._12_4_ = auVar58._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar3,auVar46);
  auVar6 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar53);
  auVar4 = vmovlhps_avx(auVar54,auVar50);
  auVar55 = vmovlhps_avx512f(auVar49,auVar51);
  auVar5 = vmovlhps_avx512f(auVar47,auVar52);
  _local_2b0 = vmovlhps_avx512f(auVar48,auVar6);
  auVar46 = vminps_avx512vl(auVar4,auVar55);
  auVar57 = vmaxps_avx512vl(auVar4,auVar55);
  auVar58 = vminps_avx512vl(auVar5,_local_2b0);
  auVar58 = vminps_avx(auVar46,auVar58);
  auVar46 = vmaxps_avx512vl(auVar5,_local_2b0);
  auVar46 = vmaxps_avx(auVar57,auVar46);
  auVar57 = vshufpd_avx(auVar58,auVar58,3);
  auVar56 = vshufpd_avx(auVar46,auVar46,3);
  auVar58 = vminps_avx(auVar58,auVar57);
  auVar46 = vmaxps_avx(auVar46,auVar56);
  auVar58 = vandps_avx512vl(auVar58,auVar241._0_16_);
  auVar46 = vandps_avx512vl(auVar46,auVar241._0_16_);
  auVar46 = vmaxps_avx(auVar58,auVar46);
  auVar58 = vmovshdup_avx(auVar46);
  auVar46 = vmaxss_avx(auVar58,auVar46);
  auVar162._8_8_ = auVar54._0_8_;
  auVar162._0_8_ = auVar54._0_8_;
  auVar58 = vmovddup_avx512vl(auVar49);
  auVar57 = vmovddup_avx512vl(auVar47);
  auVar181._0_8_ = auVar48._0_8_;
  auVar181._8_8_ = auVar181._0_8_;
  local_2c0 = ZEXT416((uint)(auVar46._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2c0);
  auVar46 = vxorps_avx512vl(local_260._0_16_,auVar116);
  local_280 = vbroadcastss_avx512vl(auVar46);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar41 = false;
  uVar33 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar56 = vsubps_avx512vl(auVar55,auVar4);
  local_290 = vsubps_avx512vl(auVar5,auVar55);
  local_2a0 = vsubps_avx512vl(_local_2b0,auVar5);
  local_3d0 = vsubps_avx(_local_360,local_350);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  local_3f0 = vsubps_avx512vl(_local_3c0,local_3a0);
  _local_400 = vsubps_avx512vl(_local_380,local_370);
  local_200 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar49 = auVar46;
LAB_01a67d06:
  auVar54 = vshufps_avx(auVar49,auVar49,0x50);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar233._16_4_ = 0x3f800000;
  auVar233._0_16_ = auVar230;
  auVar233._20_4_ = 0x3f800000;
  auVar233._24_4_ = 0x3f800000;
  auVar233._28_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar230,auVar54);
  fVar213 = auVar54._0_4_;
  fVar110 = auVar50._0_4_;
  auVar129._0_4_ = fVar110 * fVar213;
  fVar105 = auVar54._4_4_;
  fVar111 = auVar50._4_4_;
  auVar129._4_4_ = fVar111 * fVar105;
  fVar209 = auVar54._8_4_;
  auVar129._8_4_ = fVar110 * fVar209;
  fVar211 = auVar54._12_4_;
  auVar129._12_4_ = fVar111 * fVar211;
  fVar112 = auVar51._0_4_;
  auVar139._0_4_ = fVar112 * fVar213;
  fVar113 = auVar51._4_4_;
  auVar139._4_4_ = fVar113 * fVar105;
  auVar139._8_4_ = fVar112 * fVar209;
  auVar139._12_4_ = fVar113 * fVar211;
  fVar122 = auVar52._0_4_;
  auVar150._0_4_ = fVar122 * fVar213;
  fVar135 = auVar52._4_4_;
  auVar150._4_4_ = fVar135 * fVar105;
  auVar150._8_4_ = fVar122 * fVar209;
  auVar150._12_4_ = fVar135 * fVar211;
  fVar136 = auVar6._0_4_;
  auVar116._0_4_ = fVar136 * fVar213;
  fVar137 = auVar6._4_4_;
  auVar116._4_4_ = fVar137 * fVar105;
  auVar116._8_4_ = fVar136 * fVar209;
  auVar116._12_4_ = fVar137 * fVar211;
  auVar48 = vfmadd231ps_fma(auVar129,auVar47,auVar162);
  auVar53 = vfmadd231ps_avx512vl(auVar139,auVar47,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar150,auVar47,auVar57);
  auVar47 = vfmadd231ps_fma(auVar116,auVar181,auVar47);
  auVar54 = vmovshdup_avx(auVar46);
  fVar105 = auVar46._0_4_;
  fVar213 = (auVar54._0_4_ - fVar105) * 0.04761905;
  auVar176._4_4_ = fVar105;
  auVar176._0_4_ = fVar105;
  auVar176._8_4_ = fVar105;
  auVar176._12_4_ = fVar105;
  auVar176._16_4_ = fVar105;
  auVar176._20_4_ = fVar105;
  auVar176._24_4_ = fVar105;
  auVar176._28_4_ = fVar105;
  auVar127._0_8_ = auVar54._0_8_;
  auVar127._8_8_ = auVar127._0_8_;
  auVar127._16_8_ = auVar127._0_8_;
  auVar127._24_8_ = auVar127._0_8_;
  auVar79 = vsubps_avx(auVar127,auVar176);
  uVar114 = auVar48._0_4_;
  auVar128._4_4_ = uVar114;
  auVar128._0_4_ = uVar114;
  auVar128._8_4_ = uVar114;
  auVar128._12_4_ = uVar114;
  auVar128._16_4_ = uVar114;
  auVar128._20_4_ = uVar114;
  auVar128._24_4_ = uVar114;
  auVar128._28_4_ = uVar114;
  auVar195._8_4_ = 1;
  auVar195._0_8_ = 0x100000001;
  auVar195._12_4_ = 1;
  auVar195._16_4_ = 1;
  auVar195._20_4_ = 1;
  auVar195._24_4_ = 1;
  auVar195._28_4_ = 1;
  auVar88 = ZEXT1632(auVar48);
  auVar76 = vpermps_avx2(auVar195,auVar88);
  auVar77 = vbroadcastss_avx512vl(auVar53);
  auVar89 = ZEXT1632(auVar53);
  auVar78 = vpermps_avx512vl(auVar195,auVar89);
  auVar80 = vbroadcastss_avx512vl(auVar59);
  auVar73 = ZEXT1632(auVar59);
  auVar81 = vpermps_avx512vl(auVar195,auVar73);
  auVar82 = vbroadcastss_avx512vl(auVar47);
  auVar85 = ZEXT1632(auVar47);
  auVar83 = vpermps_avx512vl(auVar195,auVar85);
  auVar196._4_4_ = fVar213;
  auVar196._0_4_ = fVar213;
  auVar196._8_4_ = fVar213;
  auVar196._12_4_ = fVar213;
  auVar196._16_4_ = fVar213;
  auVar196._20_4_ = fVar213;
  auVar196._24_4_ = fVar213;
  auVar196._28_4_ = fVar213;
  auVar86 = auVar246._0_32_;
  auVar74 = vpermps_avx512vl(auVar86,auVar88);
  auVar169._8_4_ = 3;
  auVar169._0_8_ = 0x300000003;
  auVar169._12_4_ = 3;
  auVar169._16_4_ = 3;
  auVar169._20_4_ = 3;
  auVar169._24_4_ = 3;
  auVar169._28_4_ = 3;
  auVar75 = vpermps_avx512vl(auVar169,auVar88);
  auVar84 = vpermps_avx512vl(auVar86,auVar89);
  auVar88 = vpermps_avx2(auVar169,auVar89);
  auVar72 = vpermps_avx512vl(auVar86,auVar73);
  auVar89 = vpermps_avx2(auVar169,auVar73);
  auVar73 = vpermps_avx512vl(auVar86,auVar85);
  auVar85 = vpermps_avx512vl(auVar169,auVar85);
  auVar54 = vfmadd132ps_fma(auVar79,auVar176,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar233,ZEXT1632(auVar54));
  auVar86 = vmulps_avx512vl(auVar77,ZEXT1632(auVar54));
  auVar90 = ZEXT1632(auVar54);
  auVar87 = vmulps_avx512vl(auVar78,auVar90);
  auVar47 = vfmadd231ps_fma(auVar86,auVar79,auVar128);
  auVar48 = vfmadd231ps_fma(auVar87,auVar79,auVar76);
  auVar86 = vmulps_avx512vl(auVar80,auVar90);
  auVar87 = vmulps_avx512vl(auVar81,auVar90);
  auVar77 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar77);
  auVar78 = vfmadd231ps_avx512vl(auVar87,auVar79,auVar78);
  auVar86 = vmulps_avx512vl(auVar82,auVar90);
  auVar87 = ZEXT1632(auVar54);
  auVar83 = vmulps_avx512vl(auVar83,auVar87);
  auVar80 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar80);
  auVar81 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar81);
  fVar209 = auVar54._0_4_;
  fVar211 = auVar54._4_4_;
  auVar25._4_4_ = fVar211 * auVar77._4_4_;
  auVar25._0_4_ = fVar209 * auVar77._0_4_;
  fVar198 = auVar54._8_4_;
  auVar25._8_4_ = fVar198 * auVar77._8_4_;
  fVar208 = auVar54._12_4_;
  auVar25._12_4_ = fVar208 * auVar77._12_4_;
  auVar25._16_4_ = auVar77._16_4_ * 0.0;
  auVar25._20_4_ = auVar77._20_4_ * 0.0;
  auVar25._24_4_ = auVar77._24_4_ * 0.0;
  auVar25._28_4_ = fVar105;
  auVar26._4_4_ = fVar211 * auVar78._4_4_;
  auVar26._0_4_ = fVar209 * auVar78._0_4_;
  auVar26._8_4_ = fVar198 * auVar78._8_4_;
  auVar26._12_4_ = fVar208 * auVar78._12_4_;
  auVar26._16_4_ = auVar78._16_4_ * 0.0;
  auVar26._20_4_ = auVar78._20_4_ * 0.0;
  auVar26._24_4_ = auVar78._24_4_ * 0.0;
  auVar26._28_4_ = auVar76._28_4_;
  auVar47 = vfmadd231ps_fma(auVar25,auVar79,ZEXT1632(auVar47));
  auVar48 = vfmadd231ps_fma(auVar26,auVar79,ZEXT1632(auVar48));
  auVar120._0_4_ = fVar209 * auVar80._0_4_;
  auVar120._4_4_ = fVar211 * auVar80._4_4_;
  auVar120._8_4_ = fVar198 * auVar80._8_4_;
  auVar120._12_4_ = fVar208 * auVar80._12_4_;
  auVar120._16_4_ = auVar80._16_4_ * 0.0;
  auVar120._20_4_ = auVar80._20_4_ * 0.0;
  auVar120._24_4_ = auVar80._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar27._4_4_ = fVar211 * auVar81._4_4_;
  auVar27._0_4_ = fVar209 * auVar81._0_4_;
  auVar27._8_4_ = fVar198 * auVar81._8_4_;
  auVar27._12_4_ = fVar208 * auVar81._12_4_;
  auVar27._16_4_ = auVar81._16_4_ * 0.0;
  auVar27._20_4_ = auVar81._20_4_ * 0.0;
  auVar27._24_4_ = auVar81._24_4_ * 0.0;
  auVar27._28_4_ = auVar80._28_4_;
  auVar53 = vfmadd231ps_fma(auVar120,auVar79,auVar77);
  auVar59 = vfmadd231ps_fma(auVar27,auVar79,auVar78);
  auVar28._28_4_ = auVar78._28_4_;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(fVar208 * auVar59._12_4_,
                          CONCAT48(fVar198 * auVar59._8_4_,
                                   CONCAT44(fVar211 * auVar59._4_4_,fVar209 * auVar59._0_4_))));
  auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar208 * auVar53._12_4_,
                                               CONCAT48(fVar198 * auVar53._8_4_,
                                                        CONCAT44(fVar211 * auVar53._4_4_,
                                                                 fVar209 * auVar53._0_4_)))),auVar79
                            ,ZEXT1632(auVar47));
  auVar71 = vfmadd231ps_fma(auVar28,auVar79,ZEXT1632(auVar48));
  auVar76 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar47));
  auVar77 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar48));
  auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar76 = vmulps_avx512vl(auVar76,auVar78);
  auVar77 = vmulps_avx512vl(auVar77,auVar78);
  auVar190._0_4_ = fVar213 * auVar76._0_4_;
  auVar190._4_4_ = fVar213 * auVar76._4_4_;
  auVar190._8_4_ = fVar213 * auVar76._8_4_;
  auVar190._12_4_ = fVar213 * auVar76._12_4_;
  auVar190._16_4_ = fVar213 * auVar76._16_4_;
  auVar190._20_4_ = fVar213 * auVar76._20_4_;
  auVar190._24_4_ = fVar213 * auVar76._24_4_;
  auVar190._28_4_ = 0;
  auVar76 = vmulps_avx512vl(auVar196,auVar77);
  auVar48 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
  auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar68),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar121._0_4_ = auVar190._0_4_ + auVar68._0_4_;
  auVar121._4_4_ = auVar190._4_4_ + auVar68._4_4_;
  auVar121._8_4_ = auVar190._8_4_ + auVar68._8_4_;
  auVar121._12_4_ = auVar190._12_4_ + auVar68._12_4_;
  auVar121._16_4_ = auVar190._16_4_ + 0.0;
  auVar121._20_4_ = auVar190._20_4_ + 0.0;
  auVar121._24_4_ = auVar190._24_4_ + 0.0;
  auVar121._28_4_ = 0;
  auVar90 = ZEXT1632(auVar48);
  auVar81 = vpermt2ps_avx512vl(auVar190,_DAT_01fb9fc0,auVar90);
  auVar82 = vaddps_avx512vl(ZEXT1632(auVar71),auVar76);
  auVar83 = vpermt2ps_avx512vl(auVar76,_DAT_01fb9fc0,auVar90);
  auVar76 = vsubps_avx(auVar77,auVar81);
  auVar81 = vsubps_avx512vl(auVar80,auVar83);
  auVar83 = vmulps_avx512vl(auVar84,auVar87);
  auVar86 = vmulps_avx512vl(auVar88,auVar87);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar74);
  auVar74 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar75);
  auVar75 = vmulps_avx512vl(auVar72,auVar87);
  auVar86 = vmulps_avx512vl(auVar89,auVar87);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar84);
  auVar88 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar88);
  auVar84 = vmulps_avx512vl(auVar73,auVar87);
  auVar73 = vmulps_avx512vl(auVar85,auVar87);
  auVar47 = vfmadd231ps_fma(auVar84,auVar79,auVar72);
  auVar84 = vfmadd231ps_avx512vl(auVar73,auVar79,auVar89);
  auVar72 = vmulps_avx512vl(auVar87,auVar75);
  auVar85 = ZEXT1632(auVar54);
  auVar73 = vmulps_avx512vl(auVar85,auVar88);
  auVar83 = vfmadd231ps_avx512vl(auVar72,auVar79,auVar83);
  auVar74 = vfmadd231ps_avx512vl(auVar73,auVar79,auVar74);
  auVar84 = vmulps_avx512vl(auVar85,auVar84);
  auVar75 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar208 * auVar47._12_4_,
                                          CONCAT48(fVar198 * auVar47._8_4_,
                                                   CONCAT44(fVar211 * auVar47._4_4_,
                                                            fVar209 * auVar47._0_4_)))),auVar79,
                       auVar75);
  auVar88 = vfmadd231ps_avx512vl(auVar84,auVar79,auVar88);
  auVar29._4_4_ = fVar211 * auVar75._4_4_;
  auVar29._0_4_ = fVar209 * auVar75._0_4_;
  auVar29._8_4_ = fVar198 * auVar75._8_4_;
  auVar29._12_4_ = fVar208 * auVar75._12_4_;
  auVar29._16_4_ = auVar75._16_4_ * 0.0;
  auVar29._20_4_ = auVar75._20_4_ * 0.0;
  auVar29._24_4_ = auVar75._24_4_ * 0.0;
  auVar29._28_4_ = auVar89._28_4_;
  auVar89 = vmulps_avx512vl(auVar85,auVar88);
  auVar84 = vfmadd231ps_avx512vl(auVar29,auVar79,auVar83);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar74,auVar79);
  auVar79 = vsubps_avx512vl(auVar75,auVar83);
  auVar88 = vsubps_avx512vl(auVar88,auVar74);
  auVar79 = vmulps_avx512vl(auVar79,auVar78);
  auVar88 = vmulps_avx512vl(auVar88,auVar78);
  fVar105 = fVar213 * auVar79._0_4_;
  fVar209 = fVar213 * auVar79._4_4_;
  auVar30._4_4_ = fVar209;
  auVar30._0_4_ = fVar105;
  fVar211 = fVar213 * auVar79._8_4_;
  auVar30._8_4_ = fVar211;
  fVar198 = fVar213 * auVar79._12_4_;
  auVar30._12_4_ = fVar198;
  fVar208 = fVar213 * auVar79._16_4_;
  auVar30._16_4_ = fVar208;
  fVar210 = fVar213 * auVar79._20_4_;
  auVar30._20_4_ = fVar210;
  fVar213 = fVar213 * auVar79._24_4_;
  auVar30._24_4_ = fVar213;
  auVar30._28_4_ = auVar79._28_4_;
  auVar88 = vmulps_avx512vl(auVar196,auVar88);
  auVar78 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar90);
  auVar83 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar90);
  auVar197._0_4_ = auVar84._0_4_ + fVar105;
  auVar197._4_4_ = auVar84._4_4_ + fVar209;
  auVar197._8_4_ = auVar84._8_4_ + fVar211;
  auVar197._12_4_ = auVar84._12_4_ + fVar198;
  auVar197._16_4_ = auVar84._16_4_ + fVar208;
  auVar197._20_4_ = auVar84._20_4_ + fVar210;
  auVar197._24_4_ = auVar84._24_4_ + fVar213;
  auVar197._28_4_ = auVar84._28_4_ + auVar79._28_4_;
  auVar79 = vpermt2ps_avx512vl(auVar30,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar74 = vaddps_avx512vl(auVar89,auVar88);
  auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar79 = vsubps_avx(auVar78,auVar79);
  auVar88 = vsubps_avx512vl(auVar83,auVar88);
  auVar132 = ZEXT1632(auVar68);
  auVar75 = vsubps_avx512vl(auVar84,auVar132);
  auVar145 = ZEXT1632(auVar71);
  auVar72 = vsubps_avx512vl(auVar89,auVar145);
  auVar73 = vsubps_avx512vl(auVar78,auVar77);
  auVar75 = vaddps_avx512vl(auVar75,auVar73);
  auVar73 = vsubps_avx512vl(auVar83,auVar80);
  auVar72 = vaddps_avx512vl(auVar72,auVar73);
  auVar73 = vmulps_avx512vl(auVar145,auVar75);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar132,auVar72);
  auVar85 = vmulps_avx512vl(auVar82,auVar75);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar121,auVar72);
  auVar86 = vmulps_avx512vl(auVar81,auVar75);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar76,auVar72);
  auVar87 = vmulps_avx512vl(auVar80,auVar75);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar77,auVar72);
  auVar90 = vmulps_avx512vl(auVar89,auVar75);
  auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar84,auVar72);
  auVar91 = vmulps_avx512vl(auVar74,auVar75);
  auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar197,auVar72);
  auVar92 = vmulps_avx512vl(auVar88,auVar75);
  auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar79,auVar72);
  auVar75 = vmulps_avx512vl(auVar83,auVar75);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar78,auVar72);
  auVar72 = vminps_avx512vl(auVar73,auVar85);
  auVar73 = vmaxps_avx512vl(auVar73,auVar85);
  auVar85 = vminps_avx512vl(auVar86,auVar87);
  auVar72 = vminps_avx512vl(auVar72,auVar85);
  auVar85 = vmaxps_avx512vl(auVar86,auVar87);
  auVar73 = vmaxps_avx512vl(auVar73,auVar85);
  auVar85 = vminps_avx512vl(auVar90,auVar91);
  auVar86 = vmaxps_avx512vl(auVar90,auVar91);
  auVar87 = vminps_avx512vl(auVar92,auVar75);
  auVar85 = vminps_avx512vl(auVar85,auVar87);
  auVar72 = vminps_avx512vl(auVar72,auVar85);
  auVar75 = vmaxps_avx512vl(auVar92,auVar75);
  auVar75 = vmaxps_avx512vl(auVar86,auVar75);
  auVar75 = vmaxps_avx512vl(auVar73,auVar75);
  uVar17 = vcmpps_avx512vl(auVar72,local_260,2);
  uVar18 = vcmpps_avx512vl(auVar75,local_280,5);
  bVar31 = (byte)uVar17 & (byte)uVar18 & 0x7f;
  if (bVar31 != 0) {
    auVar75 = vsubps_avx512vl(auVar77,auVar132);
    auVar72 = vsubps_avx512vl(auVar80,auVar145);
    auVar73 = vsubps_avx512vl(auVar78,auVar84);
    auVar75 = vaddps_avx512vl(auVar75,auVar73);
    auVar73 = vsubps_avx512vl(auVar83,auVar89);
    auVar72 = vaddps_avx512vl(auVar72,auVar73);
    auVar73 = vmulps_avx512vl(auVar145,auVar75);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar132);
    auVar82 = vmulps_avx512vl(auVar82,auVar75);
    auVar82 = vfnmadd213ps_avx512vl(auVar121,auVar72,auVar82);
    auVar81 = vmulps_avx512vl(auVar81,auVar75);
    auVar81 = vfnmadd213ps_avx512vl(auVar76,auVar72,auVar81);
    auVar76 = vmulps_avx512vl(auVar80,auVar75);
    auVar80 = vfnmadd231ps_avx512vl(auVar76,auVar72,auVar77);
    auVar76 = vmulps_avx512vl(auVar89,auVar75);
    auVar89 = vfnmadd231ps_avx512vl(auVar76,auVar72,auVar84);
    auVar76 = vmulps_avx512vl(auVar74,auVar75);
    auVar74 = vfnmadd213ps_avx512vl(auVar197,auVar72,auVar76);
    auVar76 = vmulps_avx512vl(auVar88,auVar75);
    auVar84 = vfnmadd213ps_avx512vl(auVar79,auVar72,auVar76);
    auVar79 = vmulps_avx512vl(auVar83,auVar75);
    auVar78 = vfnmadd231ps_avx512vl(auVar79,auVar78,auVar72);
    auVar76 = vminps_avx(auVar73,auVar82);
    auVar79 = vmaxps_avx(auVar73,auVar82);
    auVar77 = vminps_avx(auVar81,auVar80);
    auVar77 = vminps_avx(auVar76,auVar77);
    auVar76 = vmaxps_avx(auVar81,auVar80);
    auVar79 = vmaxps_avx(auVar79,auVar76);
    auVar88 = vminps_avx(auVar89,auVar74);
    auVar76 = vmaxps_avx(auVar89,auVar74);
    auVar89 = vminps_avx(auVar84,auVar78);
    auVar88 = vminps_avx(auVar88,auVar89);
    auVar88 = vminps_avx(auVar77,auVar88);
    auVar77 = vmaxps_avx(auVar84,auVar78);
    auVar76 = vmaxps_avx(auVar76,auVar77);
    auVar79 = vmaxps_avx(auVar79,auVar76);
    uVar17 = vcmpps_avx512vl(auVar79,local_280,5);
    uVar18 = vcmpps_avx512vl(auVar88,local_260,2);
    bVar31 = bVar31 & (byte)uVar17 & (byte)uVar18;
    if (bVar31 != 0) {
      auStack_460[uVar33] = (uint)bVar31;
      uVar17 = vmovlps_avx(auVar46);
      (&uStack_240)[uVar33] = uVar17;
      uVar38 = vmovlps_avx(auVar49);
      auStack_1a0[uVar33] = uVar38;
      uVar33 = (ulong)((int)uVar33 + 1);
    }
  }
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar240 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar46);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar242 = ZEXT3264(auVar79);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar243 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar244 = ZEXT1664(auVar46);
  auVar245 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a68200:
  do {
    do {
      do {
        if ((int)uVar33 == 0) {
          if (bVar41) goto LAB_01a69156;
          uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar24._4_4_ = uVar114;
          auVar24._0_4_ = uVar114;
          auVar24._8_4_ = uVar114;
          auVar24._12_4_ = uVar114;
          auVar24._16_4_ = uVar114;
          auVar24._20_4_ = uVar114;
          auVar24._24_4_ = uVar114;
          auVar24._28_4_ = uVar114;
          uVar17 = vcmpps_avx512vl(local_1c0,auVar24,2);
          uVar39 = (ulong)((uint)uVar40 & (uint)uVar17);
          goto LAB_01a675a6;
        }
        uVar32 = (int)uVar33 - 1;
        uVar34 = (ulong)uVar32;
        uVar8 = auStack_460[uVar34];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auStack_1a0[uVar34];
        uVar38 = 0;
        for (uVar37 = (ulong)uVar8; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          uVar38 = uVar38 + 1;
        }
        uVar36 = uVar8 - 1 & uVar8;
        bVar44 = uVar36 == 0;
        auStack_460[uVar34] = uVar36;
        if (bVar44) {
          uVar33 = (ulong)uVar32;
        }
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar38;
        auVar46 = vpunpcklqdq_avx(auVar106,ZEXT416((int)uVar38 + 1));
        auVar46 = vcvtqq2ps_avx512vl(auVar46);
        auVar46 = vmulps_avx512vl(auVar46,auVar243._0_16_);
        uVar114 = *(undefined4 *)((long)&uStack_240 + uVar34 * 8 + 4);
        auVar19._4_4_ = uVar114;
        auVar19._0_4_ = uVar114;
        auVar19._8_4_ = uVar114;
        auVar19._12_4_ = uVar114;
        auVar54 = vmulps_avx512vl(auVar46,auVar19);
        auVar47 = auVar244._0_16_;
        auVar46 = vsubps_avx512vl(auVar47,auVar46);
        uVar114 = *(undefined4 *)(&uStack_240 + uVar34);
        auVar20._4_4_ = uVar114;
        auVar20._0_4_ = uVar114;
        auVar20._8_4_ = uVar114;
        auVar20._12_4_ = uVar114;
        auVar46 = vfmadd231ps_avx512vl(auVar54,auVar46,auVar20);
        auVar54 = vmovshdup_avx(auVar46);
        fVar213 = auVar54._0_4_ - auVar46._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        if (uVar8 == 0 || bVar44) goto LAB_01a67d06;
        auVar54 = vshufps_avx(auVar49,auVar49,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        auVar59 = vsubps_avx512vl(auVar47,auVar54);
        fVar105 = auVar54._0_4_;
        auVar140._0_4_ = fVar105 * fVar110;
        fVar209 = auVar54._4_4_;
        auVar140._4_4_ = fVar209 * fVar111;
        fVar211 = auVar54._8_4_;
        auVar140._8_4_ = fVar211 * fVar110;
        fVar198 = auVar54._12_4_;
        auVar140._12_4_ = fVar198 * fVar111;
        auVar151._0_4_ = fVar105 * fVar112;
        auVar151._4_4_ = fVar209 * fVar113;
        auVar151._8_4_ = fVar211 * fVar112;
        auVar151._12_4_ = fVar198 * fVar113;
        auVar163._0_4_ = fVar105 * fVar122;
        auVar163._4_4_ = fVar209 * fVar135;
        auVar163._8_4_ = fVar211 * fVar122;
        auVar163._12_4_ = fVar198 * fVar135;
        auVar123._0_4_ = fVar105 * fVar136;
        auVar123._4_4_ = fVar209 * fVar137;
        auVar123._8_4_ = fVar211 * fVar136;
        auVar123._12_4_ = fVar198 * fVar137;
        auVar54 = vfmadd231ps_fma(auVar140,auVar59,auVar162);
        auVar48 = vfmadd231ps_fma(auVar151,auVar59,auVar58);
        auVar53 = vfmadd231ps_fma(auVar163,auVar59,auVar57);
        auVar59 = vfmadd231ps_fma(auVar123,auVar59,auVar181);
        auVar133._16_16_ = auVar54;
        auVar133._0_16_ = auVar54;
        auVar146._16_16_ = auVar48;
        auVar146._0_16_ = auVar48;
        auVar155._16_16_ = auVar53;
        auVar155._0_16_ = auVar53;
        auVar76 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar46));
        auVar79 = vsubps_avx(auVar146,auVar133);
        auVar48 = vfmadd213ps_fma(auVar79,auVar76,auVar133);
        auVar79 = vsubps_avx(auVar155,auVar146);
        auVar68 = vfmadd213ps_fma(auVar79,auVar76,auVar146);
        auVar54 = vsubps_avx(auVar59,auVar53);
        auVar147._16_16_ = auVar54;
        auVar147._0_16_ = auVar54;
        auVar54 = vfmadd213ps_fma(auVar147,auVar76,auVar155);
        auVar79 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar48));
        auVar48 = vfmadd213ps_fma(auVar79,auVar76,ZEXT1632(auVar48));
        auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar68));
        auVar54 = vfmadd213ps_fma(auVar79,auVar76,ZEXT1632(auVar68));
        auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar48));
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar79,auVar76);
        auVar79 = vmulps_avx512vl(auVar79,auVar242._0_32_);
        auVar94._16_16_ = auVar79._16_16_;
        fVar105 = fVar213 * 0.33333334;
        auVar164._0_8_ =
             CONCAT44(auVar138._4_4_ + fVar105 * auVar79._4_4_,
                      auVar138._0_4_ + fVar105 * auVar79._0_4_);
        auVar164._8_4_ = auVar138._8_4_ + fVar105 * auVar79._8_4_;
        auVar164._12_4_ = auVar138._12_4_ + fVar105 * auVar79._12_4_;
        auVar141._0_4_ = fVar105 * auVar79._16_4_;
        auVar141._4_4_ = fVar105 * auVar79._20_4_;
        auVar141._8_4_ = fVar105 * auVar79._24_4_;
        auVar141._12_4_ = fVar105 * auVar79._28_4_;
        auVar66 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar68 = vshufpd_avx(auVar138,auVar138,3);
        auVar71 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar54 = vsubps_avx(auVar68,auVar138);
        auVar48 = vsubps_avx(auVar71,(undefined1  [16])0x0);
        auVar182._0_4_ = auVar54._0_4_ + auVar48._0_4_;
        auVar182._4_4_ = auVar54._4_4_ + auVar48._4_4_;
        auVar182._8_4_ = auVar54._8_4_ + auVar48._8_4_;
        auVar182._12_4_ = auVar54._12_4_ + auVar48._12_4_;
        auVar54 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar48 = vshufps_avx(auVar164,auVar164,0xb1);
        auVar53 = vshufps_avx(auVar66,auVar66,0xb1);
        auVar59 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar231._4_4_ = auVar182._0_4_;
        auVar231._0_4_ = auVar182._0_4_;
        auVar231._8_4_ = auVar182._0_4_;
        auVar231._12_4_ = auVar182._0_4_;
        auVar62 = vshufps_avx(auVar182,auVar182,0x55);
        fVar105 = auVar62._0_4_;
        auVar193._0_4_ = auVar54._0_4_ * fVar105;
        fVar209 = auVar62._4_4_;
        auVar193._4_4_ = auVar54._4_4_ * fVar209;
        fVar211 = auVar62._8_4_;
        auVar193._8_4_ = auVar54._8_4_ * fVar211;
        fVar198 = auVar62._12_4_;
        auVar193._12_4_ = auVar54._12_4_ * fVar198;
        auVar200._0_4_ = auVar48._0_4_ * fVar105;
        auVar200._4_4_ = auVar48._4_4_ * fVar209;
        auVar200._8_4_ = auVar48._8_4_ * fVar211;
        auVar200._12_4_ = auVar48._12_4_ * fVar198;
        auVar216._0_4_ = auVar53._0_4_ * fVar105;
        auVar216._4_4_ = auVar53._4_4_ * fVar209;
        auVar216._8_4_ = auVar53._8_4_ * fVar211;
        auVar216._12_4_ = auVar53._12_4_ * fVar198;
        auVar183._0_4_ = auVar59._0_4_ * fVar105;
        auVar183._4_4_ = auVar59._4_4_ * fVar209;
        auVar183._8_4_ = auVar59._8_4_ * fVar211;
        auVar183._12_4_ = auVar59._12_4_ * fVar198;
        auVar54 = vfmadd231ps_fma(auVar193,auVar231,auVar138);
        auVar48 = vfmadd231ps_fma(auVar200,auVar231,auVar164);
        auVar64 = vfmadd231ps_fma(auVar216,auVar231,auVar66);
        auVar65 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar231);
        auVar62 = vshufpd_avx(auVar54,auVar54,1);
        auVar63 = vshufpd_avx(auVar48,auVar48,1);
        auVar60 = vshufpd_avx512vl(auVar64,auVar64,1);
        auVar61 = vshufpd_avx512vl(auVar65,auVar65,1);
        auVar53 = vminss_avx(auVar54,auVar48);
        auVar54 = vmaxss_avx(auVar48,auVar54);
        auVar59 = vminss_avx(auVar64,auVar65);
        auVar48 = vmaxss_avx(auVar65,auVar64);
        auVar53 = vminss_avx(auVar53,auVar59);
        auVar54 = vmaxss_avx(auVar48,auVar54);
        auVar59 = vminss_avx(auVar62,auVar63);
        auVar48 = vmaxss_avx(auVar63,auVar62);
        auVar62 = vminss_avx512f(auVar60,auVar61);
        auVar63 = vmaxss_avx512f(auVar61,auVar60);
        auVar48 = vmaxss_avx(auVar63,auVar48);
        auVar59 = vminss_avx512f(auVar59,auVar62);
        fVar209 = auVar48._0_4_;
        fVar105 = auVar54._0_4_;
        if (auVar53._0_4_ < 0.0001) {
          bVar45 = fVar209 == -0.0001;
          bVar42 = NAN(fVar209);
          if (fVar209 <= -0.0001) goto LAB_01a6842a;
          break;
        }
LAB_01a6842a:
        vucomiss_avx512f(auVar59);
        bVar45 = fVar209 <= -0.0001;
        bVar43 = -0.0001 < fVar105;
        bVar42 = bVar45;
        if (!bVar45) break;
        uVar17 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar18 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar31 = (byte)uVar17 & (byte)uVar18;
        bVar13 = (bVar31 & 1) == 0;
        bVar45 = bVar43 && bVar13;
        bVar42 = bVar43 && (bVar31 & 1) == 0;
      } while (!bVar43 || !bVar13);
      auVar64 = auVar247._0_16_;
      vcmpss_avx512f(auVar53,auVar64,1);
      uVar17 = vcmpss_avx512f(auVar54,auVar64,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar94._0_16_ = auVar248._0_16_;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * auVar248._0_4_);
      vucomiss_avx512f(auVar93._0_16_);
      bVar42 = (bool)(!bVar45 | bVar42);
      bVar43 = bVar42 == false;
      auVar96._16_16_ = auVar94._16_16_;
      auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar42 * auVar247._0_4_ + (uint)!bVar42 * 0x7f800000;
      auVar63 = auVar95._0_16_;
      auVar98._16_16_ = auVar94._16_16_;
      auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar42 * auVar247._0_4_ + (uint)!bVar42 * -0x800000;
      auVar62 = auVar97._0_16_;
      uVar17 = vcmpss_avx512f(auVar59,auVar64,1);
      bVar45 = (bool)((byte)uVar17 & 1);
      auVar100._16_16_ = auVar94._16_16_;
      auVar100._0_16_ = auVar248._0_16_;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * auVar248._0_4_);
      vucomiss_avx512f(auVar99._0_16_);
      if ((bVar42) || (bVar43)) {
        auVar59 = vucomiss_avx512f(auVar53);
        if ((bVar42) || (bVar43)) {
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar65 = vxorps_avx512vl(auVar53,auVar23);
          auVar53 = vsubss_avx512f(auVar59,auVar53);
          auVar53 = vdivss_avx512f(auVar65,auVar53);
          auVar59 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
          auVar59 = vfmadd213ss_avx512f(auVar59,auVar64,auVar53);
          auVar53 = auVar59;
        }
        else {
          auVar53 = vxorps_avx512vl(auVar59,auVar59);
          vucomiss_avx512f(auVar53);
          auVar59 = ZEXT416(0x3f800000);
          if ((bVar42) || (bVar43)) {
            auVar59 = SUB6416(ZEXT464(0xff800000),0);
            auVar53 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar63 = vminss_avx512f(auVar63,auVar53);
        auVar62 = vmaxss_avx(auVar59,auVar62);
      }
      auVar248 = ZEXT464(0x3f800000);
      uVar17 = vcmpss_avx512f(auVar48,auVar64,1);
      bVar45 = (bool)((byte)uVar17 & 1);
      auVar48 = auVar248._0_16_;
      fVar211 = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * 0x3f800000);
      if ((auVar93._0_4_ != fVar211) || (NAN(auVar93._0_4_) || NAN(fVar211))) {
        if ((fVar209 != fVar105) || (NAN(fVar209) || NAN(fVar105))) {
          auVar22._8_4_ = 0x80000000;
          auVar22._0_8_ = 0x8000000080000000;
          auVar22._12_4_ = 0x80000000;
          auVar54 = vxorps_avx512vl(auVar54,auVar22);
          auVar184._0_4_ = auVar54._0_4_ / (fVar209 - fVar105);
          auVar184._4_12_ = auVar54._4_12_;
          auVar54 = vsubss_avx512f(auVar48,auVar184);
          auVar54 = vfmadd213ss_avx512f(auVar54,auVar64,auVar184);
          auVar53 = auVar54;
        }
        else if ((fVar105 != 0.0) ||
                (auVar54 = auVar48, auVar53 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar105))) {
          auVar54 = SUB6416(ZEXT464(0xff800000),0);
          auVar53 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar63 = vminss_avx(auVar63,auVar53);
        auVar62 = vmaxss_avx(auVar54,auVar62);
      }
      bVar45 = auVar99._0_4_ != fVar211;
      auVar54 = vminss_avx512f(auVar63,auVar48);
      auVar102._16_16_ = auVar94._16_16_;
      auVar102._0_16_ = auVar63;
      auVar101._4_28_ = auVar102._4_28_;
      auVar101._0_4_ = (uint)bVar45 * auVar54._0_4_ + (uint)!bVar45 * auVar63._0_4_;
      auVar54 = vmaxss_avx512f(auVar48,auVar62);
      auVar104._16_16_ = auVar94._16_16_;
      auVar104._0_16_ = auVar62;
      auVar103._4_28_ = auVar104._4_28_;
      auVar103._0_4_ = (uint)bVar45 * auVar54._0_4_ + (uint)!bVar45 * auVar62._0_4_;
      auVar54 = vmaxss_avx512f(auVar64,auVar101._0_16_);
      auVar53 = vminss_avx512f(auVar103._0_16_,auVar48);
    } while (auVar53._0_4_ < auVar54._0_4_);
    auVar64 = vmaxss_avx512f(auVar64,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
    auVar65 = vminss_avx512f(ZEXT416((uint)(auVar53._0_4_ + 0.1)),auVar48);
    auVar124._0_8_ = auVar138._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar201._8_8_ = auVar164._0_8_;
    auVar201._0_8_ = auVar164._0_8_;
    auVar217._8_8_ = auVar66._0_8_;
    auVar217._0_8_ = auVar66._0_8_;
    auVar54 = vshufpd_avx(auVar164,auVar164,3);
    auVar53 = vshufpd_avx(auVar66,auVar66,3);
    auVar59 = vshufps_avx(auVar64,auVar65,0);
    auVar63 = vsubps_avx512vl(auVar47,auVar59);
    fVar105 = auVar59._0_4_;
    auVar152._0_4_ = fVar105 * auVar68._0_4_;
    fVar209 = auVar59._4_4_;
    auVar152._4_4_ = fVar209 * auVar68._4_4_;
    fVar211 = auVar59._8_4_;
    auVar152._8_4_ = fVar211 * auVar68._8_4_;
    fVar198 = auVar59._12_4_;
    auVar152._12_4_ = fVar198 * auVar68._12_4_;
    auVar165._0_4_ = fVar105 * auVar54._0_4_;
    auVar165._4_4_ = fVar209 * auVar54._4_4_;
    auVar165._8_4_ = fVar211 * auVar54._8_4_;
    auVar165._12_4_ = fVar198 * auVar54._12_4_;
    auVar234._0_4_ = auVar53._0_4_ * fVar105;
    auVar234._4_4_ = auVar53._4_4_ * fVar209;
    auVar234._8_4_ = auVar53._8_4_ * fVar211;
    auVar234._12_4_ = auVar53._12_4_ * fVar198;
    auVar142._0_4_ = fVar105 * auVar71._0_4_;
    auVar142._4_4_ = fVar209 * auVar71._4_4_;
    auVar142._8_4_ = fVar211 * auVar71._8_4_;
    auVar142._12_4_ = fVar198 * auVar71._12_4_;
    auVar68 = vfmadd231ps_fma(auVar152,auVar63,auVar124);
    auVar71 = vfmadd231ps_fma(auVar165,auVar63,auVar201);
    auVar62 = vfmadd231ps_fma(auVar234,auVar63,auVar217);
    auVar63 = vfmadd231ps_fma(auVar142,auVar63,ZEXT816(0));
    auVar53 = vsubss_avx512f(auVar48,auVar64);
    auVar54 = vmovshdup_avx(auVar49);
    auVar138 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar64._0_4_)),auVar49,auVar53);
    auVar53 = vsubss_avx512f(auVar48,auVar65);
    auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar65._0_4_)),auVar49,auVar53);
    auVar66 = vdivss_avx512f(auVar48,ZEXT416((uint)fVar213));
    auVar54 = vsubps_avx(auVar71,auVar68);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar53 = vmulps_avx512vl(auVar54,auVar64);
    auVar54 = vsubps_avx(auVar62,auVar71);
    auVar59 = vmulps_avx512vl(auVar54,auVar64);
    auVar54 = vsubps_avx(auVar63,auVar62);
    auVar54 = vmulps_avx512vl(auVar54,auVar64);
    auVar49 = vminps_avx(auVar59,auVar54);
    auVar54 = vmaxps_avx(auVar59,auVar54);
    auVar49 = vminps_avx(auVar53,auVar49);
    auVar54 = vmaxps_avx(auVar53,auVar54);
    auVar53 = vshufpd_avx(auVar49,auVar49,3);
    auVar59 = vshufpd_avx(auVar54,auVar54,3);
    auVar49 = vminps_avx(auVar49,auVar53);
    auVar54 = vmaxps_avx(auVar54,auVar59);
    fVar213 = auVar66._0_4_;
    auVar185._0_4_ = auVar49._0_4_ * fVar213;
    auVar185._4_4_ = auVar49._4_4_ * fVar213;
    auVar185._8_4_ = auVar49._8_4_ * fVar213;
    auVar185._12_4_ = auVar49._12_4_ * fVar213;
    auVar172._0_4_ = fVar213 * auVar54._0_4_;
    auVar172._4_4_ = fVar213 * auVar54._4_4_;
    auVar172._8_4_ = fVar213 * auVar54._8_4_;
    auVar172._12_4_ = fVar213 * auVar54._12_4_;
    auVar66 = vdivss_avx512f(auVar48,ZEXT416((uint)(auVar60._0_4_ - auVar138._0_4_)));
    auVar54 = vshufpd_avx(auVar68,auVar68,3);
    auVar49 = vshufpd_avx(auVar71,auVar71,3);
    auVar53 = vshufpd_avx(auVar62,auVar62,3);
    auVar59 = vshufpd_avx(auVar63,auVar63,3);
    auVar54 = vsubps_avx(auVar54,auVar68);
    auVar68 = vsubps_avx(auVar49,auVar71);
    auVar71 = vsubps_avx(auVar53,auVar62);
    auVar59 = vsubps_avx(auVar59,auVar63);
    auVar49 = vminps_avx(auVar54,auVar68);
    auVar54 = vmaxps_avx(auVar54,auVar68);
    auVar53 = vminps_avx(auVar71,auVar59);
    auVar53 = vminps_avx(auVar49,auVar53);
    auVar49 = vmaxps_avx(auVar71,auVar59);
    auVar54 = vmaxps_avx(auVar54,auVar49);
    fVar213 = auVar66._0_4_;
    auVar218._0_4_ = fVar213 * auVar53._0_4_;
    auVar218._4_4_ = fVar213 * auVar53._4_4_;
    auVar218._8_4_ = fVar213 * auVar53._8_4_;
    auVar218._12_4_ = fVar213 * auVar53._12_4_;
    auVar202._0_4_ = fVar213 * auVar54._0_4_;
    auVar202._4_4_ = fVar213 * auVar54._4_4_;
    auVar202._8_4_ = fVar213 * auVar54._8_4_;
    auVar202._12_4_ = fVar213 * auVar54._12_4_;
    auVar59 = vinsertps_avx(auVar46,auVar138,0x10);
    auVar61 = vpermt2ps_avx512vl(auVar46,_DAT_01fb9f90,auVar60);
    auVar115._0_4_ = auVar59._0_4_ + auVar61._0_4_;
    auVar115._4_4_ = auVar59._4_4_ + auVar61._4_4_;
    auVar115._8_4_ = auVar59._8_4_ + auVar61._8_4_;
    auVar115._12_4_ = auVar59._12_4_ + auVar61._12_4_;
    auVar66 = vmulps_avx512vl(auVar115,auVar240._0_16_);
    auVar49 = vshufps_avx(auVar66,auVar66,0x54);
    uVar114 = auVar66._0_4_;
    auVar117._4_4_ = uVar114;
    auVar117._0_4_ = uVar114;
    auVar117._8_4_ = uVar114;
    auVar117._12_4_ = uVar114;
    auVar53 = vfmadd213ps_fma(auVar56,auVar117,auVar4);
    auVar68 = vfmadd213ps_fma(local_290,auVar117,auVar55);
    auVar71 = vfmadd213ps_fma(local_2a0,auVar117,auVar5);
    auVar54 = vsubps_avx(auVar68,auVar53);
    auVar53 = vfmadd213ps_fma(auVar54,auVar117,auVar53);
    auVar54 = vsubps_avx(auVar71,auVar68);
    auVar54 = vfmadd213ps_fma(auVar54,auVar117,auVar68);
    auVar54 = vsubps_avx(auVar54,auVar53);
    auVar53 = vfmadd231ps_fma(auVar53,auVar54,auVar117);
    auVar62 = vmulps_avx512vl(auVar54,auVar64);
    auVar226._8_8_ = auVar53._0_8_;
    auVar226._0_8_ = auVar53._0_8_;
    auVar54 = vshufpd_avx(auVar53,auVar53,3);
    auVar53 = vshufps_avx(auVar66,auVar66,0x55);
    auVar68 = vsubps_avx(auVar54,auVar226);
    auVar71 = vfmadd231ps_fma(auVar226,auVar53,auVar68);
    auVar235._8_8_ = auVar62._0_8_;
    auVar235._0_8_ = auVar62._0_8_;
    auVar54 = vshufpd_avx(auVar62,auVar62,3);
    auVar54 = vsubps_avx512vl(auVar54,auVar235);
    auVar54 = vfmadd213ps_avx512vl(auVar54,auVar53,auVar235);
    auVar53 = vxorps_avx512vl(auVar68,auVar239._0_16_);
    auVar62 = vmovshdup_avx512vl(auVar54);
    auVar63 = vxorps_avx512vl(auVar62,auVar239._0_16_);
    auVar64 = vmovshdup_avx512vl(auVar68);
    auVar63 = vpermt2ps_avx512vl(auVar63,ZEXT416(5),auVar68);
    auVar67 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar247 = ZEXT1664(auVar67);
    auVar68 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar68._0_4_)),auVar54,auVar64);
    auVar53 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar53);
    auVar143._0_4_ = auVar68._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar54 = vdivps_avx(auVar63,auVar143);
    auVar69 = vdivps_avx512vl(auVar53,auVar143);
    fVar213 = auVar71._0_4_;
    auVar53 = vshufps_avx(auVar71,auVar71,0x55);
    auVar227._0_4_ = fVar213 * auVar54._0_4_ + auVar53._0_4_ * auVar69._0_4_;
    auVar227._4_4_ = fVar213 * auVar54._4_4_ + auVar53._4_4_ * auVar69._4_4_;
    auVar227._8_4_ = fVar213 * auVar54._8_4_ + auVar53._8_4_ * auVar69._8_4_;
    auVar227._12_4_ = fVar213 * auVar54._12_4_ + auVar53._12_4_ * auVar69._12_4_;
    auVar64 = vsubps_avx(auVar49,auVar227);
    auVar53 = vmovshdup_avx(auVar54);
    auVar49 = vinsertps_avx(auVar185,auVar218,0x1c);
    auVar236._0_4_ = auVar53._0_4_ * auVar49._0_4_;
    auVar236._4_4_ = auVar53._4_4_ * auVar49._4_4_;
    auVar236._8_4_ = auVar53._8_4_ * auVar49._8_4_;
    auVar236._12_4_ = auVar53._12_4_ * auVar49._12_4_;
    auVar65 = vinsertps_avx512f(auVar172,auVar202,0x1c);
    auVar53 = vmulps_avx512vl(auVar53,auVar65);
    auVar63 = vminps_avx512vl(auVar236,auVar53);
    auVar71 = vmaxps_avx(auVar53,auVar236);
    auVar62 = vmovshdup_avx(auVar69);
    auVar53 = vinsertps_avx(auVar218,auVar185,0x4c);
    auVar219._0_4_ = auVar62._0_4_ * auVar53._0_4_;
    auVar219._4_4_ = auVar62._4_4_ * auVar53._4_4_;
    auVar219._8_4_ = auVar62._8_4_ * auVar53._8_4_;
    auVar219._12_4_ = auVar62._12_4_ * auVar53._12_4_;
    auVar68 = vinsertps_avx(auVar202,auVar172,0x4c);
    auVar203._0_4_ = auVar62._0_4_ * auVar68._0_4_;
    auVar203._4_4_ = auVar62._4_4_ * auVar68._4_4_;
    auVar203._8_4_ = auVar62._8_4_ * auVar68._8_4_;
    auVar203._12_4_ = auVar62._12_4_ * auVar68._12_4_;
    auVar62 = vminps_avx(auVar219,auVar203);
    auVar63 = vaddps_avx512vl(auVar63,auVar62);
    auVar62 = vmaxps_avx(auVar203,auVar219);
    auVar204._0_4_ = auVar71._0_4_ + auVar62._0_4_;
    auVar204._4_4_ = auVar71._4_4_ + auVar62._4_4_;
    auVar204._8_4_ = auVar71._8_4_ + auVar62._8_4_;
    auVar204._12_4_ = auVar71._12_4_ + auVar62._12_4_;
    auVar220._8_8_ = 0x3f80000000000000;
    auVar220._0_8_ = 0x3f80000000000000;
    auVar71 = vsubps_avx(auVar220,auVar204);
    auVar62 = vsubps_avx(auVar220,auVar63);
    auVar63 = vsubps_avx(auVar59,auVar66);
    auVar66 = vsubps_avx(auVar61,auVar66);
    fVar198 = auVar63._0_4_;
    auVar237._0_4_ = fVar198 * auVar71._0_4_;
    fVar208 = auVar63._4_4_;
    auVar237._4_4_ = fVar208 * auVar71._4_4_;
    fVar210 = auVar63._8_4_;
    auVar237._8_4_ = fVar210 * auVar71._8_4_;
    fVar212 = auVar63._12_4_;
    auVar237._12_4_ = fVar212 * auVar71._12_4_;
    auVar70 = vbroadcastss_avx512vl(auVar54);
    auVar49 = vmulps_avx512vl(auVar70,auVar49);
    auVar65 = vmulps_avx512vl(auVar70,auVar65);
    auVar70 = vminps_avx512vl(auVar49,auVar65);
    auVar65 = vmaxps_avx512vl(auVar65,auVar49);
    auVar49 = vbroadcastss_avx512vl(auVar69);
    auVar53 = vmulps_avx512vl(auVar49,auVar53);
    auVar49 = vmulps_avx512vl(auVar49,auVar68);
    auVar68 = vminps_avx512vl(auVar53,auVar49);
    auVar68 = vaddps_avx512vl(auVar70,auVar68);
    auVar63 = vmulps_avx512vl(auVar63,auVar62);
    fVar213 = auVar66._0_4_;
    auVar205._0_4_ = fVar213 * auVar71._0_4_;
    fVar105 = auVar66._4_4_;
    auVar205._4_4_ = fVar105 * auVar71._4_4_;
    fVar209 = auVar66._8_4_;
    auVar205._8_4_ = fVar209 * auVar71._8_4_;
    fVar211 = auVar66._12_4_;
    auVar205._12_4_ = fVar211 * auVar71._12_4_;
    auVar221._0_4_ = fVar213 * auVar62._0_4_;
    auVar221._4_4_ = fVar105 * auVar62._4_4_;
    auVar221._8_4_ = fVar209 * auVar62._8_4_;
    auVar221._12_4_ = fVar211 * auVar62._12_4_;
    auVar49 = vmaxps_avx(auVar49,auVar53);
    auVar173._0_4_ = auVar65._0_4_ + auVar49._0_4_;
    auVar173._4_4_ = auVar65._4_4_ + auVar49._4_4_;
    auVar173._8_4_ = auVar65._8_4_ + auVar49._8_4_;
    auVar173._12_4_ = auVar65._12_4_ + auVar49._12_4_;
    auVar186._8_8_ = 0x3f800000;
    auVar186._0_8_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar186,auVar173);
    auVar53 = vsubps_avx512vl(auVar186,auVar68);
    auVar232._0_4_ = fVar198 * auVar49._0_4_;
    auVar232._4_4_ = fVar208 * auVar49._4_4_;
    auVar232._8_4_ = fVar210 * auVar49._8_4_;
    auVar232._12_4_ = fVar212 * auVar49._12_4_;
    auVar228._0_4_ = fVar198 * auVar53._0_4_;
    auVar228._4_4_ = fVar208 * auVar53._4_4_;
    auVar228._8_4_ = fVar210 * auVar53._8_4_;
    auVar228._12_4_ = fVar212 * auVar53._12_4_;
    auVar174._0_4_ = fVar213 * auVar49._0_4_;
    auVar174._4_4_ = fVar105 * auVar49._4_4_;
    auVar174._8_4_ = fVar209 * auVar49._8_4_;
    auVar174._12_4_ = fVar211 * auVar49._12_4_;
    auVar187._0_4_ = fVar213 * auVar53._0_4_;
    auVar187._4_4_ = fVar105 * auVar53._4_4_;
    auVar187._8_4_ = fVar209 * auVar53._8_4_;
    auVar187._12_4_ = fVar211 * auVar53._12_4_;
    auVar49 = vminps_avx(auVar232,auVar228);
    auVar53 = vminps_avx512vl(auVar174,auVar187);
    auVar68 = vminps_avx512vl(auVar49,auVar53);
    auVar49 = vmaxps_avx(auVar228,auVar232);
    auVar53 = vmaxps_avx(auVar187,auVar174);
    auVar53 = vmaxps_avx(auVar53,auVar49);
    auVar71 = vminps_avx512vl(auVar237,auVar63);
    auVar49 = vminps_avx(auVar205,auVar221);
    auVar49 = vminps_avx(auVar71,auVar49);
    auVar49 = vhaddps_avx(auVar68,auVar49);
    auVar71 = vmaxps_avx512vl(auVar63,auVar237);
    auVar68 = vmaxps_avx(auVar221,auVar205);
    auVar68 = vmaxps_avx(auVar68,auVar71);
    auVar53 = vhaddps_avx(auVar53,auVar68);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
    auVar175._0_4_ = auVar49._0_4_ + auVar64._0_4_;
    auVar175._4_4_ = auVar49._4_4_ + auVar64._4_4_;
    auVar175._8_4_ = auVar49._8_4_ + auVar64._8_4_;
    auVar175._12_4_ = auVar49._12_4_ + auVar64._12_4_;
    auVar188._0_4_ = auVar53._0_4_ + auVar64._0_4_;
    auVar188._4_4_ = auVar53._4_4_ + auVar64._4_4_;
    auVar188._8_4_ = auVar53._8_4_ + auVar64._8_4_;
    auVar188._12_4_ = auVar53._12_4_ + auVar64._12_4_;
    auVar49 = vmaxps_avx(auVar59,auVar175);
    auVar53 = vminps_avx(auVar188,auVar61);
    uVar38 = vcmpps_avx512vl(auVar53,auVar49,1);
  } while ((uVar38 & 3) != 0);
  uVar38 = vcmpps_avx512vl(auVar188,auVar61,1);
  uVar17 = vcmpps_avx512vl(auVar46,auVar175,1);
  if (((ushort)uVar17 & (ushort)uVar38 & 1) == 0) {
    bVar31 = 0;
  }
  else {
    auVar49 = vmovshdup_avx(auVar175);
    bVar31 = auVar138._0_4_ < auVar49._0_4_ & (byte)(uVar38 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar33 || uVar8 != 0 && !bVar44) | bVar31) != 1) goto LAB_01a690da;
  lVar35 = 0xc9;
  do {
    lVar35 = lVar35 + -1;
    if (lVar35 == 0) goto LAB_01a68200;
    auVar46 = vsubss_avx512f(auVar48,auVar64);
    fVar209 = auVar46._0_4_;
    fVar213 = fVar209 * fVar209 * fVar209;
    fVar211 = auVar64._0_4_;
    fVar105 = fVar211 * 3.0 * fVar209 * fVar209;
    fVar209 = fVar209 * fVar211 * fVar211 * 3.0;
    auVar130._4_4_ = fVar213;
    auVar130._0_4_ = fVar213;
    auVar130._8_4_ = fVar213;
    auVar130._12_4_ = fVar213;
    auVar125._4_4_ = fVar105;
    auVar125._0_4_ = fVar105;
    auVar125._8_4_ = fVar105;
    auVar125._12_4_ = fVar105;
    auVar107._4_4_ = fVar209;
    auVar107._0_4_ = fVar209;
    auVar107._8_4_ = fVar209;
    auVar107._12_4_ = fVar209;
    fVar211 = fVar211 * fVar211 * fVar211;
    auVar153._0_4_ = (float)local_2b0._0_4_ * fVar211;
    auVar153._4_4_ = (float)local_2b0._4_4_ * fVar211;
    auVar153._8_4_ = fStack_2a8 * fVar211;
    auVar153._12_4_ = fStack_2a4 * fVar211;
    auVar46 = vfmadd231ps_fma(auVar153,auVar5,auVar107);
    auVar46 = vfmadd231ps_fma(auVar46,auVar55,auVar125);
    auVar46 = vfmadd231ps_fma(auVar46,auVar4,auVar130);
    auVar108._8_8_ = auVar46._0_8_;
    auVar108._0_8_ = auVar46._0_8_;
    auVar46 = vshufpd_avx(auVar46,auVar46,3);
    auVar49 = vshufps_avx(auVar64,auVar64,0x55);
    auVar46 = vsubps_avx(auVar46,auVar108);
    auVar49 = vfmadd213ps_fma(auVar46,auVar49,auVar108);
    fVar213 = auVar49._0_4_;
    auVar46 = vshufps_avx(auVar49,auVar49,0x55);
    auVar109._0_4_ = auVar54._0_4_ * fVar213 + auVar69._0_4_ * auVar46._0_4_;
    auVar109._4_4_ = auVar54._4_4_ * fVar213 + auVar69._4_4_ * auVar46._4_4_;
    auVar109._8_4_ = auVar54._8_4_ * fVar213 + auVar69._8_4_ * auVar46._8_4_;
    auVar109._12_4_ = auVar54._12_4_ * fVar213 + auVar69._12_4_ * auVar46._12_4_;
    auVar64 = vsubps_avx(auVar64,auVar109);
    auVar46 = vandps_avx512vl(auVar49,auVar241._0_16_);
    auVar49 = vprolq_avx512vl(auVar46,0x20);
    auVar46 = vmaxss_avx(auVar49,auVar46);
    bVar44 = (float)local_2c0._0_4_ < auVar46._0_4_;
  } while ((float)local_2c0._0_4_ <= auVar46._0_4_);
  auVar46 = vucomiss_avx512f(auVar67);
  if (bVar44) goto LAB_01a68200;
  auVar54 = vucomiss_avx512f(auVar46);
  auVar248 = ZEXT1664(auVar54);
  if (bVar44) goto LAB_01a68200;
  vmovshdup_avx(auVar46);
  auVar54 = vucomiss_avx512f(auVar67);
  if (bVar44) goto LAB_01a68200;
  auVar49 = vucomiss_avx512f(auVar54);
  auVar248 = ZEXT1664(auVar49);
  if (bVar44) goto LAB_01a68200;
  auVar48 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar66 = vinsertps_avx(auVar48,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar48 = vdpps_avx(auVar66,local_2d0,0x7f);
  auVar53 = vdpps_avx(auVar66,local_2e0,0x7f);
  auVar59 = vdpps_avx(auVar66,local_2f0,0x7f);
  auVar68 = vdpps_avx(auVar66,local_300,0x7f);
  auVar71 = vdpps_avx(auVar66,local_310,0x7f);
  auVar62 = vdpps_avx(auVar66,local_320,0x7f);
  auVar63 = vdpps_avx(auVar66,local_330,0x7f);
  auVar66 = vdpps_avx(auVar66,local_340,0x7f);
  auVar64 = vsubss_avx512f(auVar49,auVar54);
  fVar213 = auVar54._0_4_;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar71._0_4_)),auVar64,auVar48);
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar213)),auVar64,auVar53);
  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar213)),auVar64,auVar59);
  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar66._0_4_)),auVar64,auVar68);
  auVar49 = vsubss_avx512f(auVar49,auVar46);
  auVar154._0_4_ = auVar49._0_4_;
  fVar213 = auVar154._0_4_ * auVar154._0_4_ * auVar154._0_4_;
  local_120 = auVar46._0_4_;
  fVar105 = local_120 * 3.0 * auVar154._0_4_ * auVar154._0_4_;
  fVar209 = auVar154._0_4_ * local_120 * local_120 * 3.0;
  fVar211 = local_120 * local_120 * local_120;
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar59._0_4_)),ZEXT416((uint)fVar209),auVar53)
  ;
  auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar105),auVar48);
  vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar213),auVar54);
  auVar54 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar44) goto LAB_01a68200;
  fVar198 = *(float *)(ray + k * 4 + 0x100);
  if (fVar198 < auVar54._0_4_) goto LAB_01a68200;
  auVar49 = vshufps_avx(auVar46,auVar46,0x55);
  auVar53 = vsubps_avx512vl(auVar47,auVar49);
  fVar208 = auVar49._0_4_;
  auVar189._0_4_ = fVar208 * (float)local_360._0_4_;
  fVar210 = auVar49._4_4_;
  auVar189._4_4_ = fVar210 * (float)local_360._4_4_;
  fVar212 = auVar49._8_4_;
  auVar189._8_4_ = fVar212 * fStack_358;
  fVar214 = auVar49._12_4_;
  auVar189._12_4_ = fVar214 * fStack_354;
  auVar194._0_4_ = fVar208 * (float)local_3b0._0_4_;
  auVar194._4_4_ = fVar210 * (float)local_3b0._4_4_;
  auVar194._8_4_ = fVar212 * fStack_3a8;
  auVar194._12_4_ = fVar214 * fStack_3a4;
  auVar206._0_4_ = fVar208 * (float)local_3c0._0_4_;
  auVar206._4_4_ = fVar210 * (float)local_3c0._4_4_;
  auVar206._8_4_ = fVar212 * fStack_3b8;
  auVar206._12_4_ = fVar214 * fStack_3b4;
  auVar166._0_4_ = fVar208 * (float)local_380._0_4_;
  auVar166._4_4_ = fVar210 * (float)local_380._4_4_;
  auVar166._8_4_ = fVar212 * fStack_378;
  auVar166._12_4_ = fVar214 * fStack_374;
  auVar49 = vfmadd231ps_fma(auVar189,auVar53,local_350);
  auVar47 = vfmadd231ps_fma(auVar194,auVar53,local_390);
  auVar48 = vfmadd231ps_fma(auVar206,auVar53,local_3a0);
  auVar53 = vfmadd231ps_fma(auVar166,auVar53,local_370);
  auVar49 = vsubps_avx(auVar47,auVar49);
  auVar47 = vsubps_avx(auVar48,auVar47);
  auVar48 = vsubps_avx(auVar53,auVar48);
  auVar207._0_4_ = local_120 * auVar47._0_4_;
  auVar207._4_4_ = local_120 * auVar47._4_4_;
  auVar207._8_4_ = local_120 * auVar47._8_4_;
  auVar207._12_4_ = local_120 * auVar47._12_4_;
  auVar154._4_4_ = auVar154._0_4_;
  auVar154._8_4_ = auVar154._0_4_;
  auVar154._12_4_ = auVar154._0_4_;
  auVar49 = vfmadd231ps_fma(auVar207,auVar154,auVar49);
  auVar167._0_4_ = local_120 * auVar48._0_4_;
  auVar167._4_4_ = local_120 * auVar48._4_4_;
  auVar167._8_4_ = local_120 * auVar48._8_4_;
  auVar167._12_4_ = local_120 * auVar48._12_4_;
  auVar47 = vfmadd231ps_fma(auVar167,auVar154,auVar47);
  auVar168._0_4_ = local_120 * auVar47._0_4_;
  auVar168._4_4_ = local_120 * auVar47._4_4_;
  auVar168._8_4_ = local_120 * auVar47._8_4_;
  auVar168._12_4_ = local_120 * auVar47._12_4_;
  auVar49 = vfmadd231ps_fma(auVar168,auVar154,auVar49);
  auVar21._8_4_ = 0x40400000;
  auVar21._0_8_ = 0x4040000040400000;
  auVar21._12_4_ = 0x40400000;
  auVar49 = vmulps_avx512vl(auVar49,auVar21);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar31 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a690c7;
    auVar144._0_4_ = fVar211 * (float)local_400._0_4_;
    auVar144._4_4_ = fVar211 * (float)local_400._4_4_;
    auVar144._8_4_ = fVar211 * fStack_3f8;
    auVar144._12_4_ = fVar211 * fStack_3f4;
    auVar131._4_4_ = fVar209;
    auVar131._0_4_ = fVar209;
    auVar131._8_4_ = fVar209;
    auVar131._12_4_ = fVar209;
    auVar47 = vfmadd132ps_fma(auVar131,auVar144,local_3f0);
    auVar126._4_4_ = fVar105;
    auVar126._0_4_ = fVar105;
    auVar126._8_4_ = fVar105;
    auVar126._12_4_ = fVar105;
    auVar47 = vfmadd132ps_fma(auVar126,auVar47,local_3e0);
    auVar118._4_4_ = fVar213;
    auVar118._0_4_ = fVar213;
    auVar118._8_4_ = fVar213;
    auVar118._12_4_ = fVar213;
    auVar53 = vfmadd132ps_fma(auVar118,auVar47,local_3d0);
    auVar47 = vshufps_avx(auVar53,auVar53,0xc9);
    auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
    auVar119._0_4_ = auVar53._0_4_ * auVar48._0_4_;
    auVar119._4_4_ = auVar53._4_4_ * auVar48._4_4_;
    auVar119._8_4_ = auVar53._8_4_ * auVar48._8_4_;
    auVar119._12_4_ = auVar53._12_4_ * auVar48._12_4_;
    auVar49 = vfmsub231ps_fma(auVar119,auVar49,auVar47);
    auVar134._8_4_ = 1;
    auVar134._0_8_ = 0x100000001;
    auVar134._12_4_ = 1;
    auVar134._16_4_ = 1;
    auVar134._20_4_ = 1;
    auVar134._24_4_ = 1;
    auVar134._28_4_ = 1;
    local_100 = vpermps_avx2(auVar134,ZEXT1632(auVar46));
    auVar79 = vpermps_avx2(auVar134,ZEXT1632(auVar49));
    local_160 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar49));
    local_140 = auVar49._0_4_;
    local_180[0] = (RTCHitN)auVar79[0];
    local_180[1] = (RTCHitN)auVar79[1];
    local_180[2] = (RTCHitN)auVar79[2];
    local_180[3] = (RTCHitN)auVar79[3];
    local_180[4] = (RTCHitN)auVar79[4];
    local_180[5] = (RTCHitN)auVar79[5];
    local_180[6] = (RTCHitN)auVar79[6];
    local_180[7] = (RTCHitN)auVar79[7];
    local_180[8] = (RTCHitN)auVar79[8];
    local_180[9] = (RTCHitN)auVar79[9];
    local_180[10] = (RTCHitN)auVar79[10];
    local_180[0xb] = (RTCHitN)auVar79[0xb];
    local_180[0xc] = (RTCHitN)auVar79[0xc];
    local_180[0xd] = (RTCHitN)auVar79[0xd];
    local_180[0xe] = (RTCHitN)auVar79[0xe];
    local_180[0xf] = (RTCHitN)auVar79[0xf];
    local_180[0x10] = (RTCHitN)auVar79[0x10];
    local_180[0x11] = (RTCHitN)auVar79[0x11];
    local_180[0x12] = (RTCHitN)auVar79[0x12];
    local_180[0x13] = (RTCHitN)auVar79[0x13];
    local_180[0x14] = (RTCHitN)auVar79[0x14];
    local_180[0x15] = (RTCHitN)auVar79[0x15];
    local_180[0x16] = (RTCHitN)auVar79[0x16];
    local_180[0x17] = (RTCHitN)auVar79[0x17];
    local_180[0x18] = (RTCHitN)auVar79[0x18];
    local_180[0x19] = (RTCHitN)auVar79[0x19];
    local_180[0x1a] = (RTCHitN)auVar79[0x1a];
    local_180[0x1b] = (RTCHitN)auVar79[0x1b];
    local_180[0x1c] = (RTCHitN)auVar79[0x1c];
    local_180[0x1d] = (RTCHitN)auVar79[0x1d];
    local_180[0x1e] = (RTCHitN)auVar79[0x1e];
    local_180[0x1f] = (RTCHitN)auVar79[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = auVar54._0_4_;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar9->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar9->occlusionFilterN)(&local_450);
      auVar245 = ZEXT3264(_DAT_01fb9fe0);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar244 = ZEXT1664(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar243 = ZEXT1664(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar241 = ZEXT1664(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar240 = ZEXT1664(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar239 = ZEXT1664(auVar46);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar246 = ZEXT3264(auVar79);
    }
    if (local_420 == (undefined1  [32])0x0) {
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar242 = ZEXT3264(auVar79);
      auVar46 = vxorps_avx512vl(auVar67,auVar67);
      auVar247 = ZEXT1664(auVar46);
    }
    else {
      p_Var10 = context->args->filter;
      if (p_Var10 == (RTCFilterFunctionN)0x0) {
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar242 = ZEXT3264(auVar79);
        auVar46 = vxorps_avx512vl(auVar67,auVar67);
        auVar247 = ZEXT1664(auVar46);
      }
      else {
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar242 = ZEXT3264(auVar79);
        auVar46 = vxorps_avx512vl(auVar67,auVar67);
        auVar247 = ZEXT1664(auVar46);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var10)(&local_450);
          auVar46 = vxorps_avx512vl(auVar46,auVar46);
          auVar247 = ZEXT1664(auVar46);
          auVar245 = ZEXT3264(_DAT_01fb9fe0);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar244 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar243 = ZEXT1664(auVar46);
          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar242 = ZEXT3264(auVar79);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar241 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar240 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar239 = ZEXT1664(auVar46);
          auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar246 = ZEXT3264(auVar79);
        }
      }
      auVar248 = ZEXT464(0x3f800000);
      uVar38 = vptestmd_avx512vl(local_420,local_420);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar44 = (bool)((byte)uVar38 & 1);
      bVar45 = (bool)((byte)(uVar38 >> 1) & 1);
      bVar42 = (bool)((byte)(uVar38 >> 2) & 1);
      bVar43 = (bool)((byte)(uVar38 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar38 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar38 >> 6) & 1);
      bVar16 = SUB81(uVar38 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar44 * auVar79._0_4_ | (uint)!bVar44 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar45 * auVar79._4_4_ | (uint)!bVar45 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar42 * auVar79._8_4_ | (uint)!bVar42 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar43 * auVar79._12_4_ | (uint)!bVar43 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar13 * auVar79._16_4_ | (uint)!bVar13 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar14 * auVar79._20_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar15 * auVar79._24_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar16 * auVar79._28_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x11c);
      bVar31 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_01a690c7;
    }
    auVar248 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x100) = fVar198;
  }
  bVar31 = 0;
LAB_01a690c7:
  bVar41 = (bool)(bVar41 | bVar31);
  goto LAB_01a68200;
LAB_01a690da:
  auVar49 = vinsertps_avx(auVar138,auVar60,0x10);
  goto LAB_01a67d06;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }